

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curveNi_mb_intersector.h
# Opt level: O1

bool embree::avx512::CurveNiMBIntersectorK<4,4>::
     occluded_n<embree::avx512::OrientedCurve1IntersectorK<embree::BezierCurveT,4>,embree::avx512::Occluded1KEpilog1<4,true>>
               (Precalculations *pre,RayK<4> *ray,size_t k,RayQueryContext *context,Primitive *prim)

{
  long lVar1;
  long lVar2;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar3;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar4;
  Primitive PVar5;
  uint uVar6;
  Geometry *pGVar7;
  __int_type_conflict _Var8;
  long lVar9;
  long lVar10;
  long lVar11;
  RTCFilterFunctionN p_Var12;
  bool bVar13;
  bool bVar14;
  bool bVar15;
  undefined8 uVar16;
  undefined8 uVar17;
  bool bVar18;
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  byte bVar25;
  uint uVar26;
  ulong uVar27;
  uint uVar29;
  ulong uVar30;
  long lVar31;
  long lVar32;
  uint uVar33;
  bool bVar34;
  bool bVar35;
  ulong uVar36;
  ulong uVar37;
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 in_YmmResult [32];
  undefined1 auVar62 [32];
  undefined1 auVar63 [32];
  undefined1 auVar64 [32];
  undefined1 auVar65 [32];
  undefined1 auVar66 [32];
  undefined1 auVar67 [32];
  undefined1 auVar68 [32];
  undefined1 auVar69 [32];
  undefined1 auVar70 [32];
  undefined1 auVar71 [32];
  undefined1 auVar72 [32];
  undefined1 auVar73 [32];
  undefined1 auVar74 [32];
  undefined1 auVar75 [32];
  undefined1 auVar76 [32];
  undefined1 auVar77 [32];
  undefined1 auVar78 [32];
  undefined1 auVar79 [32];
  undefined1 auVar80 [32];
  undefined1 auVar81 [32];
  undefined1 auVar82 [32];
  undefined1 auVar83 [32];
  undefined1 auVar84 [32];
  undefined1 auVar86 [32];
  undefined1 auVar88 [32];
  undefined1 auVar90 [32];
  undefined1 auVar92 [32];
  int iVar94;
  float fVar95;
  undefined4 uVar96;
  vint4 bi_2;
  undefined1 auVar97 [16];
  undefined1 auVar98 [16];
  undefined1 auVar99 [16];
  vint4 bi_1;
  undefined1 auVar100 [16];
  undefined1 auVar101 [16];
  undefined1 auVar102 [16];
  undefined1 auVar103 [16];
  undefined1 auVar104 [16];
  undefined1 auVar105 [16];
  undefined1 auVar106 [16];
  undefined1 auVar107 [16];
  undefined1 auVar108 [16];
  undefined1 auVar109 [16];
  undefined1 auVar110 [16];
  undefined1 auVar111 [32];
  vint4 bi;
  undefined1 auVar112 [16];
  undefined1 auVar113 [16];
  undefined1 auVar114 [16];
  undefined1 auVar115 [16];
  undefined1 auVar116 [16];
  undefined1 auVar117 [16];
  undefined1 auVar118 [16];
  undefined1 auVar119 [16];
  undefined1 auVar120 [32];
  float fVar138;
  float fVar139;
  undefined1 auVar121 [16];
  undefined1 auVar122 [16];
  float fVar140;
  undefined1 auVar123 [16];
  undefined1 auVar124 [16];
  undefined1 auVar125 [16];
  undefined1 auVar126 [16];
  undefined1 auVar127 [16];
  undefined1 auVar128 [16];
  undefined1 auVar129 [16];
  undefined1 auVar130 [16];
  undefined1 auVar131 [16];
  undefined1 auVar132 [16];
  undefined1 auVar133 [16];
  undefined1 auVar134 [16];
  undefined1 auVar135 [32];
  undefined1 auVar136 [32];
  undefined1 auVar137 [32];
  vint4 ai_2;
  undefined1 auVar141 [16];
  undefined1 auVar142 [16];
  undefined1 auVar143 [16];
  undefined1 auVar144 [16];
  undefined1 auVar145 [16];
  undefined1 auVar146 [16];
  undefined1 auVar147 [32];
  undefined1 auVar148 [32];
  vint4 ai_1;
  undefined1 auVar149 [16];
  undefined1 auVar150 [16];
  undefined1 auVar151 [16];
  undefined1 auVar152 [16];
  undefined1 auVar153 [16];
  undefined1 auVar154 [16];
  undefined1 auVar155 [16];
  undefined1 auVar156 [16];
  undefined1 auVar157 [16];
  undefined1 auVar158 [16];
  undefined1 auVar159 [16];
  undefined1 auVar160 [16];
  undefined1 auVar161 [16];
  undefined1 auVar162 [16];
  undefined1 auVar163 [16];
  undefined1 auVar164 [16];
  undefined1 auVar165 [16];
  vint4 ai;
  undefined1 auVar166 [16];
  undefined1 auVar167 [16];
  undefined1 auVar168 [16];
  undefined1 auVar169 [16];
  undefined1 auVar170 [16];
  undefined1 auVar171 [16];
  undefined1 auVar172 [16];
  undefined1 auVar173 [16];
  undefined1 auVar174 [16];
  undefined1 auVar175 [16];
  undefined1 auVar176 [32];
  undefined1 auVar177 [16];
  undefined1 auVar178 [16];
  undefined1 auVar179 [16];
  undefined1 auVar180 [16];
  undefined1 auVar181 [16];
  undefined1 auVar182 [16];
  undefined1 auVar183 [16];
  undefined1 auVar184 [16];
  undefined1 auVar185 [16];
  undefined1 auVar186 [16];
  undefined1 auVar187 [16];
  __m128 a;
  undefined1 auVar188 [16];
  undefined1 auVar189 [16];
  undefined1 auVar190 [16];
  undefined1 auVar191 [16];
  undefined1 auVar192 [16];
  undefined1 auVar193 [16];
  undefined1 auVar194 [16];
  undefined1 auVar195 [16];
  undefined1 auVar196 [16];
  undefined1 auVar197 [16];
  undefined1 auVar198 [16];
  undefined1 auVar199 [16];
  undefined1 auVar200 [16];
  undefined1 auVar201 [16];
  undefined1 auVar202 [16];
  undefined1 auVar203 [16];
  undefined1 auVar204 [16];
  undefined1 auVar205 [16];
  undefined1 auVar206 [16];
  undefined1 auVar207 [32];
  undefined1 auVar208 [32];
  float fVar209;
  float fVar219;
  float fVar220;
  vfloat4 a0_2;
  undefined1 auVar210 [16];
  float fVar221;
  undefined1 auVar211 [16];
  undefined1 auVar212 [16];
  undefined1 auVar213 [16];
  undefined1 auVar214 [16];
  undefined1 auVar215 [16];
  undefined1 auVar216 [16];
  undefined1 auVar217 [16];
  undefined1 auVar218 [16];
  float fVar222;
  float fVar223;
  float fVar224;
  vfloat4 a0_3;
  undefined1 auVar225 [16];
  undefined1 auVar226 [16];
  undefined1 auVar227 [16];
  undefined1 auVar228 [16];
  undefined1 auVar229 [16];
  undefined1 auVar230 [16];
  undefined1 auVar231 [16];
  vfloat4 b0_2;
  undefined1 auVar232 [16];
  undefined1 auVar233 [16];
  undefined1 auVar234 [16];
  undefined1 auVar235 [16];
  undefined1 auVar236 [16];
  undefined1 auVar237 [16];
  undefined1 auVar238 [16];
  undefined1 auVar239 [16];
  undefined1 auVar240 [16];
  undefined1 auVar241 [16];
  undefined1 auVar242 [16];
  undefined1 auVar243 [16];
  undefined1 auVar244 [16];
  undefined1 auVar245 [16];
  undefined1 auVar247 [16];
  undefined1 auVar248 [16];
  undefined1 auVar249 [16];
  undefined1 auVar250 [16];
  undefined1 auVar251 [16];
  undefined1 auVar252 [16];
  undefined1 auVar253 [16];
  undefined1 auVar254 [16];
  vfloat4 b0_3;
  undefined1 auVar255 [16];
  undefined1 auVar256 [16];
  undefined1 auVar257 [16];
  undefined1 auVar258 [16];
  undefined1 auVar259 [64];
  undefined1 in_ZMM17 [64];
  undefined1 in_ZMM18 [64];
  undefined1 in_ZMM22 [64];
  undefined1 auVar260 [64];
  undefined1 auVar261 [64];
  undefined1 auVar262 [64];
  undefined1 auVar263 [64];
  int iVar264;
  undefined1 in_ZMM31 [64];
  undefined1 auVar265 [64];
  uint mask_stack [4];
  RTCFilterFunctionNArguments args;
  BBox1f cu_stack [4];
  BBox1f cv_stack [4];
  bool local_489;
  undefined8 local_3f8;
  undefined8 uStack_3f0;
  ulong local_3e8;
  Primitive *local_3e0;
  undefined1 local_3d8 [16];
  undefined1 local_3c8 [8];
  float fStack_3c0;
  float fStack_3bc;
  undefined1 local_3b8 [8];
  float fStack_3b0;
  float fStack_3ac;
  undefined1 local_3a8 [8];
  float fStack_3a0;
  float fStack_39c;
  undefined1 local_398 [8];
  float fStack_390;
  float fStack_38c;
  undefined1 local_388 [8];
  float fStack_380;
  float fStack_37c;
  undefined1 local_378 [16];
  undefined1 local_368 [16];
  undefined1 local_358 [16];
  undefined1 local_348 [16];
  uint auStack_338 [4];
  RTCFilterFunctionNArguments local_328;
  undefined1 local_2f8 [16];
  undefined1 local_2e8 [16];
  undefined1 local_2d8 [8];
  float fStack_2d0;
  float fStack_2cc;
  undefined1 local_2c8 [16];
  undefined1 local_2b8 [16];
  undefined1 local_2a8 [16];
  undefined1 local_298 [16];
  undefined1 local_288 [16];
  undefined1 local_278 [8];
  float fStack_270;
  float fStack_26c;
  undefined1 local_268 [8];
  float fStack_260;
  float fStack_25c;
  undefined1 local_258 [8];
  float fStack_250;
  float fStack_24c;
  undefined1 local_248 [8];
  float fStack_240;
  float fStack_23c;
  undefined1 local_238 [16];
  undefined1 local_228 [16];
  undefined1 local_218 [16];
  undefined1 local_208 [16];
  undefined1 local_1f8 [16];
  undefined1 local_1e8 [16];
  undefined1 local_1d8 [16];
  undefined1 local_1c8 [16];
  undefined1 local_1b8 [16];
  undefined1 local_1a8 [16];
  undefined1 local_198 [16];
  undefined1 local_188 [16];
  undefined1 local_178 [16];
  undefined1 local_168 [16];
  undefined1 local_158 [16];
  uint uStack_148;
  float afStack_144 [7];
  RTCHitN local_128 [16];
  undefined1 local_118 [16];
  undefined4 local_108;
  undefined4 uStack_104;
  undefined4 uStack_100;
  undefined4 uStack_fc;
  float local_f8;
  float fStack_f4;
  float fStack_f0;
  float fStack_ec;
  undefined1 local_e8 [16];
  undefined8 local_d8;
  undefined8 uStack_d0;
  undefined1 local_c8 [16];
  uint local_b8;
  uint uStack_b4;
  uint uStack_b0;
  uint uStack_ac;
  uint uStack_a8;
  uint uStack_a4;
  uint uStack_a0;
  uint uStack_9c;
  undefined1 local_98 [32];
  undefined1 local_78 [32];
  ulong auStack_58 [5];
  ulong uVar28;
  undefined1 auVar85 [32];
  undefined1 auVar87 [32];
  undefined1 auVar89 [32];
  undefined1 auVar91 [32];
  undefined1 auVar93 [32];
  undefined1 auVar246 [32];
  
  PVar5 = prim[1];
  uVar27 = (ulong)(byte)PVar5;
  lVar31 = uVar27 * 0x25;
  fVar95 = *(float *)(prim + lVar31 + 0x12);
  auVar38 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x10)),
                          0x10);
  auVar38 = vinsertps_avx(auVar38,ZEXT416(*(uint *)(ray + k * 4 + 0x20)),0x20);
  auVar39 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4 + 0x40)),
                          ZEXT416(*(uint *)(ray + k * 4 + 0x50)),0x10);
  auVar39 = vinsertps_avx(auVar39,ZEXT416(*(uint *)(ray + k * 4 + 0x60)),0x20);
  auVar38 = vsubps_avx(auVar38,*(undefined1 (*) [16])(prim + lVar31 + 6));
  auVar121._0_4_ = fVar95 * auVar38._0_4_;
  auVar121._4_4_ = fVar95 * auVar38._4_4_;
  auVar121._8_4_ = fVar95 * auVar38._8_4_;
  auVar121._12_4_ = fVar95 * auVar38._12_4_;
  auVar38 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar27 * 4 + 6)));
  auVar41._0_4_ = fVar95 * auVar39._0_4_;
  auVar41._4_4_ = fVar95 * auVar39._4_4_;
  auVar41._8_4_ = fVar95 * auVar39._8_4_;
  auVar41._12_4_ = fVar95 * auVar39._12_4_;
  auVar38 = vcvtdq2ps_avx(auVar38);
  auVar39 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar27 * 5 + 6)));
  auVar39 = vcvtdq2ps_avx(auVar39);
  auVar47 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar27 * 6 + 6)));
  auVar46 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar27 * 0xf + 6)));
  auVar47 = vcvtdq2ps_avx(auVar47);
  auVar46 = vcvtdq2ps_avx(auVar46);
  auVar53 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + (ulong)(byte)PVar5 * 0x10 + 6)));
  auVar53 = vcvtdq2ps_avx(auVar53);
  auVar50 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + (ulong)(byte)PVar5 * 0x10 + uVar27 + 6)));
  auVar50 = vcvtdq2ps_avx(auVar50);
  auVar51 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar27 * 0x1a + 6)));
  auVar51 = vcvtdq2ps_avx(auVar51);
  auVar52 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar27 * 0x1b + 6)));
  auVar52 = vcvtdq2ps_avx(auVar52);
  auVar54 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar27 * 0x1c + 6)));
  auVar54 = vcvtdq2ps_avx(auVar54);
  auVar149._4_4_ = auVar41._0_4_;
  auVar149._0_4_ = auVar41._0_4_;
  auVar149._8_4_ = auVar41._0_4_;
  auVar149._12_4_ = auVar41._0_4_;
  auVar55 = vshufps_avx(auVar41,auVar41,0x55);
  auVar56 = vshufps_avx(auVar41,auVar41,0xaa);
  fVar95 = auVar56._0_4_;
  auVar112._0_4_ = fVar95 * auVar47._0_4_;
  fVar224 = auVar56._4_4_;
  auVar112._4_4_ = fVar224 * auVar47._4_4_;
  fVar209 = auVar56._8_4_;
  auVar112._8_4_ = fVar209 * auVar47._8_4_;
  fVar219 = auVar56._12_4_;
  auVar112._12_4_ = fVar219 * auVar47._12_4_;
  auVar49._0_4_ = auVar50._0_4_ * fVar95;
  auVar49._4_4_ = auVar50._4_4_ * fVar224;
  auVar49._8_4_ = auVar50._8_4_ * fVar209;
  auVar49._12_4_ = auVar50._12_4_ * fVar219;
  auVar42._0_4_ = auVar54._0_4_ * fVar95;
  auVar42._4_4_ = auVar54._4_4_ * fVar224;
  auVar42._8_4_ = auVar54._8_4_ * fVar209;
  auVar42._12_4_ = auVar54._12_4_ * fVar219;
  auVar56 = vfmadd231ps_fma(auVar112,auVar55,auVar39);
  auVar57 = vfmadd231ps_fma(auVar49,auVar55,auVar53);
  auVar55 = vfmadd231ps_fma(auVar42,auVar52,auVar55);
  auVar58 = vfmadd231ps_fma(auVar56,auVar149,auVar38);
  auVar57 = vfmadd231ps_fma(auVar57,auVar149,auVar46);
  auVar59 = vfmadd231ps_fma(auVar55,auVar51,auVar149);
  auVar247._4_4_ = auVar121._0_4_;
  auVar247._0_4_ = auVar121._0_4_;
  auVar247._8_4_ = auVar121._0_4_;
  auVar247._12_4_ = auVar121._0_4_;
  auVar55 = vshufps_avx(auVar121,auVar121,0x55);
  auVar56 = vshufps_avx(auVar121,auVar121,0xaa);
  fVar95 = auVar56._0_4_;
  auVar150._0_4_ = fVar95 * auVar47._0_4_;
  fVar224 = auVar56._4_4_;
  auVar150._4_4_ = fVar224 * auVar47._4_4_;
  fVar209 = auVar56._8_4_;
  auVar150._8_4_ = fVar209 * auVar47._8_4_;
  fVar219 = auVar56._12_4_;
  auVar150._12_4_ = fVar219 * auVar47._12_4_;
  auVar141._0_4_ = auVar50._0_4_ * fVar95;
  auVar141._4_4_ = auVar50._4_4_ * fVar224;
  auVar141._8_4_ = auVar50._8_4_ * fVar209;
  auVar141._12_4_ = auVar50._12_4_ * fVar219;
  auVar122._0_4_ = auVar54._0_4_ * fVar95;
  auVar122._4_4_ = auVar54._4_4_ * fVar224;
  auVar122._8_4_ = auVar54._8_4_ * fVar209;
  auVar122._12_4_ = auVar54._12_4_ * fVar219;
  auVar39 = vfmadd231ps_fma(auVar150,auVar55,auVar39);
  auVar47 = vfmadd231ps_fma(auVar141,auVar55,auVar53);
  auVar53 = vfmadd231ps_fma(auVar122,auVar55,auVar52);
  auVar40 = vfmadd231ps_fma(auVar39,auVar247,auVar38);
  auVar41 = vfmadd231ps_fma(auVar47,auVar247,auVar46);
  auVar80._16_16_ = in_YmmResult._16_16_;
  auVar38 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
  auVar261 = ZEXT1664(auVar38);
  auVar42 = vfmadd231ps_fma(auVar53,auVar247,auVar51);
  auVar39 = vandps_avx512vl(auVar58,auVar38);
  auVar177._8_4_ = 0x219392ef;
  auVar177._0_8_ = 0x219392ef219392ef;
  auVar177._12_4_ = 0x219392ef;
  uVar36 = vcmpps_avx512vl(auVar39,auVar177,1);
  bVar34 = (bool)((byte)uVar36 & 1);
  auVar43._0_4_ = (uint)bVar34 * 0x219392ef | (uint)!bVar34 * auVar58._0_4_;
  bVar34 = (bool)((byte)(uVar36 >> 1) & 1);
  auVar43._4_4_ = (uint)bVar34 * 0x219392ef | (uint)!bVar34 * auVar58._4_4_;
  bVar34 = (bool)((byte)(uVar36 >> 2) & 1);
  auVar43._8_4_ = (uint)bVar34 * 0x219392ef | (uint)!bVar34 * auVar58._8_4_;
  bVar34 = (bool)((byte)(uVar36 >> 3) & 1);
  auVar43._12_4_ = (uint)bVar34 * 0x219392ef | (uint)!bVar34 * auVar58._12_4_;
  auVar39 = vandps_avx512vl(auVar57,auVar38);
  uVar36 = vcmpps_avx512vl(auVar39,auVar177,1);
  bVar34 = (bool)((byte)uVar36 & 1);
  auVar44._0_4_ = (uint)bVar34 * 0x219392ef | (uint)!bVar34 * auVar57._0_4_;
  bVar34 = (bool)((byte)(uVar36 >> 1) & 1);
  auVar44._4_4_ = (uint)bVar34 * 0x219392ef | (uint)!bVar34 * auVar57._4_4_;
  bVar34 = (bool)((byte)(uVar36 >> 2) & 1);
  auVar44._8_4_ = (uint)bVar34 * 0x219392ef | (uint)!bVar34 * auVar57._8_4_;
  bVar34 = (bool)((byte)(uVar36 >> 3) & 1);
  auVar44._12_4_ = (uint)bVar34 * 0x219392ef | (uint)!bVar34 * auVar57._12_4_;
  auVar38 = vandps_avx512vl(auVar59,auVar38);
  uVar36 = vcmpps_avx512vl(auVar38,auVar177,1);
  bVar34 = (bool)((byte)uVar36 & 1);
  auVar45._0_4_ = (uint)bVar34 * 0x219392ef | (uint)!bVar34 * auVar59._0_4_;
  bVar34 = (bool)((byte)(uVar36 >> 1) & 1);
  auVar45._4_4_ = (uint)bVar34 * 0x219392ef | (uint)!bVar34 * auVar59._4_4_;
  bVar34 = (bool)((byte)(uVar36 >> 2) & 1);
  auVar45._8_4_ = (uint)bVar34 * 0x219392ef | (uint)!bVar34 * auVar59._8_4_;
  bVar34 = (bool)((byte)(uVar36 >> 3) & 1);
  auVar45._12_4_ = (uint)bVar34 * 0x219392ef | (uint)!bVar34 * auVar59._12_4_;
  auVar39 = vrcp14ps_avx512vl(auVar43);
  auVar178._8_4_ = 0x3f800000;
  auVar178._0_8_ = &DAT_3f8000003f800000;
  auVar178._12_4_ = 0x3f800000;
  auVar38 = vfnmadd213ps_fma(auVar43,auVar39,auVar178);
  auVar58 = vfmadd132ps_fma(auVar38,auVar39,auVar39);
  auVar39 = vrcp14ps_avx512vl(auVar44);
  auVar38 = vfnmadd213ps_fma(auVar44,auVar39,auVar178);
  auVar59 = vfmadd132ps_fma(auVar38,auVar39,auVar39);
  auVar39 = vrcp14ps_avx512vl(auVar45);
  auVar38 = vfnmadd213ps_fma(auVar45,auVar39,auVar178);
  auVar60 = vfmadd132ps_fma(auVar38,auVar39,auVar39);
  fVar95 = (*(float *)(ray + k * 4 + 0x70) - *(float *)(prim + lVar31 + 0x16)) *
           *(float *)(prim + lVar31 + 0x1a);
  auVar166._4_4_ = fVar95;
  auVar166._0_4_ = fVar95;
  auVar166._8_4_ = fVar95;
  auVar166._12_4_ = fVar95;
  auVar38._8_8_ = 0;
  auVar38._0_8_ = *(ulong *)(prim + uVar27 * 7 + 6);
  auVar38 = vpmovsxwd_avx(auVar38);
  auVar38 = vcvtdq2ps_avx(auVar38);
  auVar39._8_8_ = 0;
  auVar39._0_8_ = *(ulong *)(prim + uVar27 * 0xb + 6);
  auVar39 = vpmovsxwd_avx(auVar39);
  auVar39 = vcvtdq2ps_avx(auVar39);
  auVar46 = vsubps_avx(auVar39,auVar38);
  auVar47._8_8_ = 0;
  auVar47._0_8_ = *(ulong *)(prim + uVar27 * 9 + 6);
  auVar39 = vpmovsxwd_avx(auVar47);
  auVar47 = vfmadd213ps_fma(auVar46,auVar166,auVar38);
  auVar38 = vcvtdq2ps_avx(auVar39);
  auVar46._8_8_ = 0;
  auVar46._0_8_ = *(ulong *)(prim + uVar27 * 0xd + 6);
  auVar39 = vpmovsxwd_avx(auVar46);
  auVar39 = vcvtdq2ps_avx(auVar39);
  auVar39 = vsubps_avx(auVar39,auVar38);
  auVar46 = vfmadd213ps_fma(auVar39,auVar166,auVar38);
  auVar53._8_8_ = 0;
  auVar53._0_8_ = *(ulong *)(prim + uVar27 * 0x12 + 6);
  auVar38 = vpmovsxwd_avx(auVar53);
  auVar38 = vcvtdq2ps_avx(auVar38);
  uVar36 = (ulong)(uint)((int)(uVar27 * 5) << 2);
  auVar50._8_8_ = 0;
  auVar50._0_8_ = *(ulong *)(prim + uVar27 * 2 + uVar36 + 6);
  auVar39 = vpmovsxwd_avx(auVar50);
  auVar39 = vcvtdq2ps_avx(auVar39);
  auVar39 = vsubps_avx(auVar39,auVar38);
  auVar53 = vfmadd213ps_fma(auVar39,auVar166,auVar38);
  auVar51._8_8_ = 0;
  auVar51._0_8_ = *(ulong *)(prim + uVar36 + 6);
  auVar38 = vpmovsxwd_avx(auVar51);
  auVar38 = vcvtdq2ps_avx(auVar38);
  auVar52._8_8_ = 0;
  auVar52._0_8_ = *(ulong *)(prim + uVar27 * 0x18 + 6);
  auVar39 = vpmovsxwd_avx(auVar52);
  auVar39 = vcvtdq2ps_avx(auVar39);
  auVar39 = vsubps_avx(auVar39,auVar38);
  auVar50 = vfmadd213ps_fma(auVar39,auVar166,auVar38);
  auVar54._8_8_ = 0;
  auVar54._0_8_ = *(ulong *)(prim + uVar27 * 0x1d + 6);
  auVar38 = vpmovsxwd_avx(auVar54);
  auVar38 = vcvtdq2ps_avx(auVar38);
  auVar55._8_8_ = 0;
  auVar55._0_8_ = *(ulong *)(prim + uVar27 + (ulong)(byte)PVar5 * 0x20 + 6);
  auVar39 = vpmovsxwd_avx(auVar55);
  auVar39 = vcvtdq2ps_avx(auVar39);
  auVar39 = vsubps_avx(auVar39,auVar38);
  auVar51 = vfmadd213ps_fma(auVar39,auVar166,auVar38);
  auVar56._8_8_ = 0;
  auVar56._0_8_ = *(ulong *)(prim + ((ulong)(byte)PVar5 * 0x20 - uVar27) + 6);
  auVar38 = vpmovsxwd_avx(auVar56);
  auVar38 = vcvtdq2ps_avx(auVar38);
  auVar57._8_8_ = 0;
  auVar57._0_8_ = *(ulong *)(prim + uVar27 * 0x23 + 6);
  auVar39 = vpmovsxwd_avx(auVar57);
  auVar39 = vcvtdq2ps_avx(auVar39);
  auVar39 = vsubps_avx(auVar39,auVar38);
  auVar39 = vfmadd213ps_fma(auVar39,auVar166,auVar38);
  auVar38 = vsubps_avx(auVar47,auVar40);
  auVar167._0_4_ = auVar58._0_4_ * auVar38._0_4_;
  auVar167._4_4_ = auVar58._4_4_ * auVar38._4_4_;
  auVar167._8_4_ = auVar58._8_4_ * auVar38._8_4_;
  auVar167._12_4_ = auVar58._12_4_ * auVar38._12_4_;
  auVar38 = vsubps_avx(auVar46,auVar40);
  auVar113._0_4_ = auVar58._0_4_ * auVar38._0_4_;
  auVar113._4_4_ = auVar58._4_4_ * auVar38._4_4_;
  auVar113._8_4_ = auVar58._8_4_ * auVar38._8_4_;
  auVar113._12_4_ = auVar58._12_4_ * auVar38._12_4_;
  auVar38 = vsubps_avx(auVar53,auVar41);
  auVar151._0_4_ = auVar59._0_4_ * auVar38._0_4_;
  auVar151._4_4_ = auVar59._4_4_ * auVar38._4_4_;
  auVar151._8_4_ = auVar59._8_4_ * auVar38._8_4_;
  auVar151._12_4_ = auVar59._12_4_ * auVar38._12_4_;
  auVar38 = vsubps_avx(auVar50,auVar41);
  auVar61._0_4_ = auVar59._0_4_ * auVar38._0_4_;
  auVar61._4_4_ = auVar59._4_4_ * auVar38._4_4_;
  auVar61._8_4_ = auVar59._8_4_ * auVar38._8_4_;
  auVar61._12_4_ = auVar59._12_4_ * auVar38._12_4_;
  auVar38 = vsubps_avx(auVar51,auVar42);
  auVar142._0_4_ = auVar60._0_4_ * auVar38._0_4_;
  auVar142._4_4_ = auVar60._4_4_ * auVar38._4_4_;
  auVar142._8_4_ = auVar60._8_4_ * auVar38._8_4_;
  auVar142._12_4_ = auVar60._12_4_ * auVar38._12_4_;
  auVar38 = vsubps_avx(auVar39,auVar42);
  auVar48._0_4_ = auVar60._0_4_ * auVar38._0_4_;
  auVar48._4_4_ = auVar60._4_4_ * auVar38._4_4_;
  auVar48._8_4_ = auVar60._8_4_ * auVar38._8_4_;
  auVar48._12_4_ = auVar60._12_4_ * auVar38._12_4_;
  auVar38 = vpminsd_avx(auVar167,auVar113);
  auVar39 = vpminsd_avx(auVar151,auVar61);
  auVar38 = vmaxps_avx(auVar38,auVar39);
  auVar39 = vpminsd_avx(auVar142,auVar48);
  uVar96 = *(undefined4 *)(ray + k * 4 + 0x30);
  auVar58._4_4_ = uVar96;
  auVar58._0_4_ = uVar96;
  auVar58._8_4_ = uVar96;
  auVar58._12_4_ = uVar96;
  auVar39 = vmaxps_avx512vl(auVar39,auVar58);
  auVar38 = vmaxps_avx(auVar38,auVar39);
  auVar59._8_4_ = 0x3f7ffffa;
  auVar59._0_8_ = 0x3f7ffffa3f7ffffa;
  auVar59._12_4_ = 0x3f7ffffa;
  local_288 = vmulps_avx512vl(auVar38,auVar59);
  auVar38 = vpmaxsd_avx(auVar167,auVar113);
  auVar39 = vpmaxsd_avx(auVar151,auVar61);
  auVar38 = vminps_avx(auVar38,auVar39);
  auVar39 = vpmaxsd_avx(auVar142,auVar48);
  uVar96 = *(undefined4 *)(ray + k * 4 + 0x80);
  auVar60._4_4_ = uVar96;
  auVar60._0_4_ = uVar96;
  auVar60._8_4_ = uVar96;
  auVar60._12_4_ = uVar96;
  auVar39 = vminps_avx512vl(auVar39,auVar60);
  auVar38 = vminps_avx(auVar38,auVar39);
  auVar40._8_4_ = 0x3f800003;
  auVar40._0_8_ = 0x3f8000033f800003;
  auVar40._12_4_ = 0x3f800003;
  auVar38 = vmulps_avx512vl(auVar38,auVar40);
  auVar39 = vpbroadcastd_avx512vl();
  uVar16 = vcmpps_avx512vl(local_288,auVar38,2);
  uVar36 = vpcmpgtd_avx512vl(auVar39,_DAT_01ff0cf0);
  uVar36 = ((byte)uVar16 & 0xf) & uVar36;
  bVar34 = (char)uVar36 == '\0';
  local_489 = !bVar34;
  if (bVar34) {
    return local_489;
  }
  local_2f8 = vpmovm2d_avx512vl((ulong)(uint)(1 << ((uint)k & 0x1f)));
  auVar38 = vxorps_avx512vl(in_ZMM31._0_16_,in_ZMM31._0_16_);
  auVar265 = ZEXT1664(auVar38);
  auVar38 = vbroadcastss_avx512vl(ZEXT416(0x40400000));
  auVar260 = ZEXT1664(auVar38);
  local_3e0 = prim;
LAB_01c221ab:
  lVar31 = 0;
  for (uVar27 = uVar36; (uVar27 & 1) == 0; uVar27 = uVar27 >> 1 | 0x8000000000000000) {
    lVar31 = lVar31 + 1;
  }
  uVar27 = (ulong)*(uint *)(local_3e0 + 2);
  pGVar7 = (context->scene->geometries).items[uVar27].ptr;
  fVar95 = (pGVar7->time_range).lower;
  fVar95 = pGVar7->fnumTimeSegments *
           ((*(float *)(ray + k * 4 + 0x70) - fVar95) / ((pGVar7->time_range).upper - fVar95));
  auVar38 = vroundss_avx(ZEXT416((uint)fVar95),ZEXT416((uint)fVar95),9);
  auVar38 = vminss_avx(auVar38,ZEXT416((uint)(pGVar7->fnumTimeSegments + -1.0)));
  auVar40 = vmaxss_avx512f(auVar265._0_16_,auVar38);
  uVar30 = (ulong)*(uint *)(*(long *)&pGVar7->field_0x58 +
                           (ulong)*(uint *)(local_3e0 + lVar31 * 4 + 6) *
                           pGVar7[1].super_RefCount.refCounter.super___atomic_base<unsigned_long>.
                           _M_i);
  _Var8 = pGVar7[4].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
  lVar32 = (long)(int)auVar40._0_4_ * 0x38;
  lVar9 = *(long *)(_Var8 + lVar32);
  lVar10 = *(long *)(_Var8 + 0x10 + lVar32);
  auVar38 = *(undefined1 (*) [16])(lVar9 + lVar10 * uVar30);
  lVar31 = uVar30 + 1;
  auVar39 = *(undefined1 (*) [16])(lVar9 + lVar10 * lVar31);
  lVar1 = uVar30 + 2;
  auVar47 = *(undefined1 (*) [16])(lVar9 + lVar10 * lVar1);
  lVar2 = uVar30 + 3;
  auVar46 = *(undefined1 (*) [16])(lVar9 + lVar10 * lVar2);
  lVar9 = *(long *)&pGVar7[4].fnumTimeSegments;
  lVar10 = *(long *)(lVar9 + lVar32);
  lVar11 = *(long *)(lVar9 + 0x10 + lVar32);
  auVar53 = *(undefined1 (*) [16])(lVar10 + lVar11 * uVar30);
  auVar50 = *(undefined1 (*) [16])(lVar10 + lVar11 * lVar31);
  auVar51 = *(undefined1 (*) [16])(lVar10 + lVar11 * lVar1);
  auVar52 = *(undefined1 (*) [16])(lVar10 + lVar11 * lVar2);
  lVar10 = *(long *)(_Var8 + 0x38 + lVar32);
  lVar11 = *(long *)(_Var8 + 0x48 + lVar32);
  auVar54 = *(undefined1 (*) [16])(lVar10 + lVar11 * uVar30);
  auVar55 = *(undefined1 (*) [16])(lVar10 + lVar11 * lVar31);
  auVar56 = *(undefined1 (*) [16])(lVar10 + lVar11 * lVar1);
  auVar57 = *(undefined1 (*) [16])(lVar10 + lVar11 * lVar2);
  local_298 = vpbroadcastd_avx512vl();
  lVar10 = *(long *)(lVar9 + 0x38 + lVar32);
  lVar9 = *(long *)(lVar9 + 0x48 + lVar32);
  auVar58 = *(undefined1 (*) [16])(lVar10 + uVar30 * lVar9);
  auVar59 = *(undefined1 (*) [16])(lVar10 + lVar31 * lVar9);
  auVar60 = *(undefined1 (*) [16])(lVar10 + lVar1 * lVar9);
  auVar40 = vsubss_avx512f(ZEXT416((uint)fVar95),auVar40);
  auVar76._0_16_ = vxorps_avx512vl(in_ZMM22._0_16_,in_ZMM22._0_16_);
  auVar41 = vmulps_avx512vl(auVar46,auVar76._0_16_);
  auVar41 = vfmadd231ps_avx512vl(auVar41,auVar47,auVar76._0_16_);
  auVar42 = vxorps_avx512vl(in_ZMM17._0_16_,in_ZMM17._0_16_);
  auVar42 = vfmadd213ps_avx512vl(auVar42,auVar39,auVar41);
  auVar42 = vaddps_avx512vl(auVar38,auVar42);
  auVar61 = auVar260._0_16_;
  auVar41 = vfmadd231ps_avx512vl(auVar41,auVar39,auVar61);
  auVar41 = vfnmadd231ps_avx512vl(auVar41,auVar38,auVar61);
  auVar43 = vmulps_avx512vl(auVar52,auVar76._0_16_);
  auVar43 = vfmadd231ps_avx512vl(auVar43,auVar51,auVar76._0_16_);
  auVar44 = vxorps_avx512vl(in_ZMM18._0_16_,in_ZMM18._0_16_);
  auVar44 = vfmadd213ps_avx512vl(auVar44,auVar50,auVar43);
  auVar45 = vaddps_avx512vl(auVar53,auVar44);
  auVar43 = vfmadd231ps_avx512vl(auVar43,auVar50,auVar61);
  auVar43 = vfnmadd231ps_avx512vl(auVar43,auVar53,auVar61);
  auVar44 = vxorps_avx512vl(auVar44,auVar44);
  auVar44 = vfmadd213ps_avx512vl(auVar44,auVar47,auVar46);
  auVar44 = vfmadd231ps_avx512vl(auVar44,auVar39,auVar76._0_16_);
  auVar44 = vfmadd231ps_avx512vl(auVar44,auVar38,auVar76._0_16_);
  auVar46 = vmulps_avx512vl(auVar46,auVar61);
  auVar47 = vfnmadd231ps_avx512vl(auVar46,auVar61,auVar47);
  auVar39 = vfmadd231ps_avx512vl(auVar47,auVar76._0_16_,auVar39);
  auVar48 = vfnmadd231ps_avx512vl(auVar39,auVar76._0_16_,auVar38);
  auVar38 = vfmadd213ps_fma(ZEXT816(0) << 0x20,auVar51,auVar52);
  auVar38 = vfmadd231ps_avx512vl(auVar38,auVar50,auVar76._0_16_);
  auVar49 = vfmadd231ps_avx512vl(auVar38,auVar53,auVar76._0_16_);
  auVar38 = vmulps_avx512vl(auVar52,auVar61);
  auVar38 = vfnmadd231ps_avx512vl(auVar38,auVar61,auVar51);
  auVar38 = vfmadd231ps_avx512vl(auVar38,auVar76._0_16_,auVar50);
  auVar50 = vfnmadd231ps_avx512vl(auVar38,auVar76._0_16_,auVar53);
  auVar38 = vshufps_avx(auVar41,auVar41,0xc9);
  auVar39 = vshufps_avx512vl(auVar45,auVar45,0xc9);
  fVar223 = auVar41._0_4_;
  auVar152._0_4_ = fVar223 * auVar39._0_4_;
  fVar138 = auVar41._4_4_;
  auVar152._4_4_ = fVar138 * auVar39._4_4_;
  fVar139 = auVar41._8_4_;
  auVar152._8_4_ = fVar139 * auVar39._8_4_;
  fVar140 = auVar41._12_4_;
  auVar152._12_4_ = fVar140 * auVar39._12_4_;
  auVar39 = vfmsub231ps_avx512vl(auVar152,auVar38,auVar45);
  auVar47 = vshufps_avx(auVar39,auVar39,0xc9);
  auVar39 = vshufps_avx512vl(auVar43,auVar43,0xc9);
  auVar168._0_4_ = fVar223 * auVar39._0_4_;
  auVar168._4_4_ = fVar138 * auVar39._4_4_;
  auVar168._8_4_ = fVar139 * auVar39._8_4_;
  auVar168._12_4_ = fVar140 * auVar39._12_4_;
  auVar38 = vfmsub231ps_avx512vl(auVar168,auVar38,auVar43);
  auVar46 = vshufps_avx(auVar38,auVar38,0xc9);
  auVar38 = vshufps_avx(auVar48,auVar48,0xc9);
  auVar39 = vshufps_avx(auVar49,auVar49,0xc9);
  fVar95 = auVar48._0_4_;
  auVar188._0_4_ = auVar39._0_4_ * fVar95;
  fVar224 = auVar48._4_4_;
  auVar188._4_4_ = auVar39._4_4_ * fVar224;
  fVar209 = auVar48._8_4_;
  auVar188._8_4_ = auVar39._8_4_ * fVar209;
  fVar219 = auVar48._12_4_;
  auVar188._12_4_ = auVar39._12_4_ * fVar219;
  auVar39 = vfmsub231ps_fma(auVar188,auVar38,auVar49);
  auVar53 = vshufps_avx(auVar39,auVar39,0xc9);
  auVar39 = vshufps_avx(auVar50,auVar50,0xc9);
  auVar189._0_4_ = auVar39._0_4_ * fVar95;
  auVar189._4_4_ = auVar39._4_4_ * fVar224;
  auVar189._8_4_ = auVar39._8_4_ * fVar209;
  auVar189._12_4_ = auVar39._12_4_ * fVar219;
  auVar38 = vfmsub231ps_fma(auVar189,auVar38,auVar50);
  auVar50 = vshufps_avx(auVar38,auVar38,0xc9);
  auVar38 = vdpps_avx(auVar47,auVar47,0x7f);
  auVar76._16_16_ = auVar80._16_16_;
  auVar62._4_28_ = auVar76._4_28_;
  auVar62._0_4_ = auVar38._0_4_;
  auVar39 = vrsqrt14ss_avx512f(auVar76._0_16_,auVar62._0_16_);
  auVar51 = vmulss_avx512f(auVar39,ZEXT416(0x3fc00000));
  auVar52 = vmulss_avx512f(auVar38,ZEXT416(0x3f000000));
  auVar52 = vmulss_avx512f(auVar52,auVar39);
  auVar39 = vmulss_avx512f(auVar52,ZEXT416((uint)(auVar39._0_4_ * auVar39._0_4_)));
  auVar39 = vsubss_avx512f(auVar51,auVar39);
  auVar200._0_4_ = auVar39._0_4_;
  auVar200._4_4_ = auVar200._0_4_;
  auVar200._8_4_ = auVar200._0_4_;
  auVar200._12_4_ = auVar200._0_4_;
  auVar51 = vmulps_avx512vl(auVar47,auVar200);
  auVar39 = vdpps_avx(auVar47,auVar46,0x7f);
  auVar52 = vbroadcastss_avx512vl(auVar38);
  auVar46 = vmulps_avx512vl(auVar52,auVar46);
  fVar220 = auVar39._0_4_;
  auVar153._0_4_ = fVar220 * auVar47._0_4_;
  auVar153._4_4_ = fVar220 * auVar47._4_4_;
  auVar153._8_4_ = fVar220 * auVar47._8_4_;
  auVar153._12_4_ = fVar220 * auVar47._12_4_;
  auVar47 = vsubps_avx(auVar46,auVar153);
  auVar39 = vrcp14ss_avx512f(auVar76._0_16_,auVar62._0_16_);
  auVar38 = vfnmadd213ss_avx512f(auVar38,auVar39,ZEXT416(0x40000000));
  fVar220 = auVar39._0_4_ * auVar38._0_4_;
  auVar38 = vdpps_avx(auVar53,auVar53,0x7f);
  auVar78._16_16_ = auVar80._16_16_;
  auVar78._0_16_ = auVar76._0_16_;
  auVar79._4_28_ = auVar78._4_28_;
  auVar79._0_4_ = auVar38._0_4_;
  auVar39 = vrsqrt14ss_avx512f(auVar76._0_16_,auVar79._0_16_);
  auVar46 = vmulss_avx512f(auVar39,ZEXT416(0x3fc00000));
  auVar52 = vmulss_avx512f(auVar38,ZEXT416(0x3f000000));
  fVar221 = auVar39._0_4_;
  fVar222 = auVar46._0_4_ - auVar52._0_4_ * fVar221 * fVar221 * fVar221;
  auVar201._0_4_ = fVar222 * auVar53._0_4_;
  auVar201._4_4_ = fVar222 * auVar53._4_4_;
  auVar201._8_4_ = fVar222 * auVar53._8_4_;
  auVar201._12_4_ = fVar222 * auVar53._12_4_;
  auVar39 = vdpps_avx(auVar53,auVar50,0x7f);
  auVar46 = vbroadcastss_avx512vl(auVar38);
  auVar46 = vmulps_avx512vl(auVar46,auVar50);
  fVar221 = auVar39._0_4_;
  auVar97._0_4_ = fVar221 * auVar53._0_4_;
  auVar97._4_4_ = fVar221 * auVar53._4_4_;
  auVar97._8_4_ = fVar221 * auVar53._8_4_;
  auVar97._12_4_ = fVar221 * auVar53._12_4_;
  auVar39 = vsubps_avx(auVar46,auVar97);
  auVar46 = vrcp14ss_avx512f(auVar76._0_16_,auVar79._0_16_);
  auVar38 = vfnmadd213ss_avx512f(auVar38,auVar46,ZEXT416(0x40000000));
  fVar221 = auVar46._0_4_ * auVar38._0_4_;
  auVar46 = vshufps_avx512vl(auVar42,auVar42,0xff);
  auVar53 = vmulps_avx512vl(auVar46,auVar51);
  auVar50 = vsubps_avx512vl(auVar42,auVar53);
  auVar38 = vshufps_avx(auVar41,auVar41,0xff);
  auVar38 = vmulps_avx512vl(auVar38,auVar51);
  auVar143._0_4_ = auVar38._0_4_ + auVar46._0_4_ * auVar200._0_4_ * fVar220 * auVar47._0_4_;
  auVar143._4_4_ = auVar38._4_4_ + auVar46._4_4_ * auVar200._0_4_ * fVar220 * auVar47._4_4_;
  auVar143._8_4_ = auVar38._8_4_ + auVar46._8_4_ * auVar200._0_4_ * fVar220 * auVar47._8_4_;
  auVar143._12_4_ = auVar38._12_4_ + auVar46._12_4_ * auVar200._0_4_ * fVar220 * auVar47._12_4_;
  auVar38 = vsubps_avx(auVar41,auVar143);
  auVar51 = vaddps_avx512vl(auVar42,auVar53);
  auVar47 = vshufps_avx512vl(auVar44,auVar44,0xff);
  auVar232._0_4_ = auVar201._0_4_ * auVar47._0_4_;
  auVar232._4_4_ = auVar201._4_4_ * auVar47._4_4_;
  auVar232._8_4_ = auVar201._8_4_ * auVar47._8_4_;
  auVar232._12_4_ = auVar201._12_4_ * auVar47._12_4_;
  auVar52 = vsubps_avx512vl(auVar44,auVar232);
  auVar46 = vshufps_avx512vl(auVar48,auVar48,0xff);
  auVar53 = vmulps_avx512vl(auVar46,auVar201);
  auVar154._0_4_ = auVar53._0_4_ + auVar47._0_4_ * fVar222 * auVar39._0_4_ * fVar221;
  auVar154._4_4_ = auVar53._4_4_ + auVar47._4_4_ * fVar222 * auVar39._4_4_ * fVar221;
  auVar154._8_4_ = auVar53._8_4_ + auVar47._8_4_ * fVar222 * auVar39._8_4_ * fVar221;
  auVar154._12_4_ = auVar53._12_4_ + auVar47._12_4_ * fVar222 * auVar39._12_4_ * fVar221;
  auVar39 = vsubps_avx(auVar48,auVar154);
  auVar41 = vaddps_avx512vl(auVar44,auVar232);
  auVar179._0_4_ = auVar50._0_4_ + auVar38._0_4_ * 0.33333334;
  auVar179._4_4_ = auVar50._4_4_ + auVar38._4_4_ * 0.33333334;
  auVar179._8_4_ = auVar50._8_4_ + auVar38._8_4_ * 0.33333334;
  auVar179._12_4_ = auVar50._12_4_ + auVar38._12_4_ * 0.33333334;
  auVar155._0_4_ = auVar39._0_4_ * 0.33333334;
  auVar155._4_4_ = auVar39._4_4_ * 0.33333334;
  auVar155._8_4_ = auVar39._8_4_ * 0.33333334;
  auVar155._12_4_ = auVar39._12_4_ * 0.33333334;
  auVar53 = vsubps_avx(auVar52,auVar155);
  auVar156._0_4_ = (fVar223 + auVar143._0_4_) * 0.33333334;
  auVar156._4_4_ = (fVar138 + auVar143._4_4_) * 0.33333334;
  auVar156._8_4_ = (fVar139 + auVar143._8_4_) * 0.33333334;
  auVar156._12_4_ = (fVar140 + auVar143._12_4_) * 0.33333334;
  auVar42 = vaddps_avx512vl(auVar51,auVar156);
  auVar169._0_4_ = (fVar95 + auVar154._0_4_) * 0.33333334;
  auVar169._4_4_ = (fVar224 + auVar154._4_4_) * 0.33333334;
  auVar169._8_4_ = (fVar209 + auVar154._8_4_) * 0.33333334;
  auVar169._12_4_ = (fVar219 + auVar154._12_4_) * 0.33333334;
  auVar43 = vsubps_avx512vl(auVar41,auVar169);
  auVar38 = *(undefined1 (*) [16])(lVar10 + lVar9 * lVar2);
  auVar39 = vmulps_avx512vl(auVar57,auVar76._0_16_);
  auVar39 = vfmadd231ps_avx512vl(auVar39,auVar56,auVar76._0_16_);
  auVar47 = vxorps_avx512vl(auVar46,auVar46);
  auVar47 = vfmadd213ps_avx512vl(auVar47,auVar55,auVar39);
  auVar45 = vaddps_avx512vl(auVar54,auVar47);
  auVar39 = vfmadd231ps_avx512vl(auVar39,auVar55,auVar61);
  auVar48 = vfnmadd231ps_avx512vl(auVar39,auVar54,auVar61);
  auVar39 = vmulps_avx512vl(auVar38,auVar76._0_16_);
  auVar39 = vfmadd231ps_avx512vl(auVar39,auVar60,auVar76._0_16_);
  auVar47 = vxorps_avx512vl(auVar44,auVar44);
  auVar47 = vfmadd213ps_avx512vl(auVar47,auVar59,auVar39);
  auVar46 = vaddps_avx512vl(auVar58,auVar47);
  auVar39 = vfmadd231ps_avx512vl(auVar39,auVar59,auVar61);
  auVar39 = vfnmadd231ps_avx512vl(auVar39,auVar58,auVar61);
  auVar47 = vxorps_avx512vl(auVar47,auVar47);
  auVar47 = vfmadd213ps_avx512vl(auVar47,auVar56,auVar57);
  auVar47 = vfmadd231ps_avx512vl(auVar47,auVar55,auVar76._0_16_);
  auVar44 = vfmadd231ps_avx512vl(auVar47,auVar54,auVar76._0_16_);
  auVar47 = vmulps_avx512vl(auVar57,auVar61);
  auVar47 = vfnmadd231ps_avx512vl(auVar47,auVar61,auVar56);
  auVar47 = vfmadd231ps_avx512vl(auVar47,auVar76._0_16_,auVar55);
  auVar54 = vfnmadd231ps_avx512vl(auVar47,auVar76._0_16_,auVar54);
  auVar47 = vfmadd213ps_avx512vl(ZEXT816(0) << 0x20,auVar60,auVar38);
  auVar47 = vfmadd231ps_avx512vl(auVar47,auVar59,auVar76._0_16_);
  auVar55 = vfmadd231ps_avx512vl(auVar47,auVar58,auVar76._0_16_);
  auVar38 = vmulps_avx512vl(auVar38,auVar61);
  auVar38 = vfnmadd231ps_avx512vl(auVar38,auVar61,auVar60);
  auVar38 = vfmadd231ps_avx512vl(auVar38,auVar76._0_16_,auVar59);
  auVar56 = vfnmadd231ps_avx512vl(auVar38,auVar76._0_16_,auVar58);
  auVar38 = vshufps_avx(auVar48,auVar48,0xc9);
  auVar47 = vshufps_avx512vl(auVar46,auVar46,0xc9);
  fVar209 = auVar48._0_4_;
  auVar248._0_4_ = fVar209 * auVar47._0_4_;
  fVar219 = auVar48._4_4_;
  auVar248._4_4_ = fVar219 * auVar47._4_4_;
  fVar220 = auVar48._8_4_;
  auVar248._8_4_ = fVar220 * auVar47._8_4_;
  fVar221 = auVar48._12_4_;
  auVar248._12_4_ = fVar221 * auVar47._12_4_;
  auVar47 = vfmsub231ps_avx512vl(auVar248,auVar38,auVar46);
  auVar47 = vshufps_avx(auVar47,auVar47,0xc9);
  auVar46 = vshufps_avx512vl(auVar39,auVar39,0xc9);
  auVar255._0_4_ = fVar209 * auVar46._0_4_;
  auVar255._4_4_ = fVar219 * auVar46._4_4_;
  auVar255._8_4_ = fVar220 * auVar46._8_4_;
  auVar255._12_4_ = fVar221 * auVar46._12_4_;
  auVar38 = vfmsub231ps_avx512vl(auVar255,auVar38,auVar39);
  auVar46 = vshufps_avx(auVar38,auVar38,0xc9);
  auVar39 = vshufps_avx(auVar54,auVar54,0xc9);
  auVar38 = vshufps_avx512vl(auVar55,auVar55,0xc9);
  auVar38 = vmulps_avx512vl(auVar54,auVar38);
  auVar38 = vfmsub231ps_avx512vl(auVar38,auVar39,auVar55);
  auVar55 = vshufps_avx512vl(auVar38,auVar38,0xc9);
  auVar57 = vshufps_avx512vl(auVar56,auVar56,0xc9);
  auVar38 = vdpps_avx(auVar47,auVar47,0x7f);
  auVar57 = vmulps_avx512vl(auVar54,auVar57);
  auVar39 = vfmsub231ps_avx512vl(auVar57,auVar39,auVar56);
  auVar56 = vshufps_avx512vl(auVar39,auVar39,0xc9);
  auVar63._16_16_ = auVar80._16_16_;
  auVar63._0_16_ = auVar76._0_16_;
  auVar64._4_28_ = auVar63._4_28_;
  auVar64._0_4_ = auVar38._0_4_;
  auVar39 = vrsqrt14ss_avx512f(auVar76._0_16_,auVar64._0_16_);
  auVar57 = vmulss_avx512f(auVar39,ZEXT416(0x3fc00000));
  auVar58 = vmulss_avx512f(auVar38,ZEXT416(0x3f000000));
  auVar58 = vmulss_avx512f(auVar58,auVar39);
  auVar39 = vmulss_avx512f(auVar39,auVar39);
  auVar39 = vmulss_avx512f(auVar58,auVar39);
  auVar39 = vsubss_avx512f(auVar57,auVar39);
  auVar57 = vbroadcastss_avx512vl(auVar39);
  auVar58 = vmulps_avx512vl(auVar47,auVar57);
  auVar39 = vdpps_avx(auVar47,auVar46,0x7f);
  auVar59 = vbroadcastss_avx512vl(auVar38);
  auVar46 = vmulps_avx512vl(auVar59,auVar46);
  fVar95 = auVar39._0_4_;
  auVar157._0_4_ = auVar47._0_4_ * fVar95;
  auVar157._4_4_ = auVar47._4_4_ * fVar95;
  auVar157._8_4_ = auVar47._8_4_ * fVar95;
  auVar157._12_4_ = auVar47._12_4_ * fVar95;
  auVar39 = vsubps_avx(auVar46,auVar157);
  auVar47 = vrcp14ss_avx512f(auVar76._0_16_,auVar64._0_16_);
  auVar38 = vfnmadd213ss_avx512f(auVar38,auVar47,ZEXT416(0x40000000));
  fVar95 = auVar47._0_4_ * auVar38._0_4_;
  auVar38 = vdpps_avx(auVar55,auVar55,0x7f);
  auVar100._0_4_ = fVar95 * auVar39._0_4_;
  auVar100._4_4_ = fVar95 * auVar39._4_4_;
  auVar100._8_4_ = fVar95 * auVar39._8_4_;
  auVar100._12_4_ = fVar95 * auVar39._12_4_;
  auVar47 = vmulps_avx512vl(auVar57,auVar100);
  auVar66._16_16_ = auVar80._16_16_;
  auVar66._0_16_ = auVar76._0_16_;
  auVar65._4_28_ = auVar66._4_28_;
  auVar65._0_4_ = auVar38._0_4_;
  auVar39 = vrsqrt14ss_avx512f(auVar76._0_16_,auVar65._0_16_);
  auVar46 = vmulss_avx512f(auVar39,ZEXT416(0x3fc00000));
  auVar60 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
  auVar57 = vmulss_avx512f(auVar38,ZEXT416(0x3f000000));
  auVar262 = ZEXT464(0x3f800000);
  auVar57 = vmulss_avx512f(auVar57,auVar39);
  auVar39 = vmulss_avx512f(auVar57,ZEXT416((uint)(auVar39._0_4_ * auVar39._0_4_)));
  fVar224 = auVar46._0_4_ - auVar39._0_4_;
  auVar256._0_4_ = auVar55._0_4_ * fVar224;
  auVar256._4_4_ = auVar55._4_4_ * fVar224;
  auVar256._8_4_ = auVar55._8_4_ * fVar224;
  auVar256._12_4_ = auVar55._12_4_ * fVar224;
  auVar39 = vdpps_avx(auVar55,auVar56,0x7f);
  auVar46 = vbroadcastss_avx512vl(auVar38);
  auVar46 = vmulps_avx512vl(auVar46,auVar56);
  fVar95 = auVar39._0_4_;
  auVar170._0_4_ = auVar55._0_4_ * fVar95;
  auVar170._4_4_ = auVar55._4_4_ * fVar95;
  auVar170._8_4_ = auVar55._8_4_ * fVar95;
  auVar170._12_4_ = auVar55._12_4_ * fVar95;
  auVar39 = vsubps_avx(auVar46,auVar170);
  auVar46 = vrcp14ss_avx512f(auVar76._0_16_,auVar65._0_16_);
  auVar38 = vfnmadd213ss_avx512f(auVar38,auVar46,ZEXT416(0x40000000));
  fVar95 = auVar38._0_4_ * auVar46._0_4_;
  auVar46 = vshufps_avx512vl(auVar45,auVar45,0xff);
  auVar55 = vmulps_avx512vl(auVar46,auVar58);
  auVar56 = vsubps_avx512vl(auVar45,auVar55);
  auVar38 = vshufps_avx(auVar48,auVar48,0xff);
  auVar38 = vmulps_avx512vl(auVar38,auVar58);
  auVar101._0_4_ = auVar38._0_4_ + auVar46._0_4_ * auVar47._0_4_;
  auVar101._4_4_ = auVar38._4_4_ + auVar46._4_4_ * auVar47._4_4_;
  auVar101._8_4_ = auVar38._8_4_ + auVar46._8_4_ * auVar47._8_4_;
  auVar101._12_4_ = auVar38._12_4_ + auVar46._12_4_ * auVar47._12_4_;
  auVar38 = vsubps_avx(auVar48,auVar101);
  auVar47 = vaddps_avx512vl(auVar45,auVar55);
  auVar46 = vshufps_avx512vl(auVar44,auVar44,0xff);
  auVar233._0_4_ = auVar46._0_4_ * auVar256._0_4_;
  auVar233._4_4_ = auVar46._4_4_ * auVar256._4_4_;
  auVar233._8_4_ = auVar46._8_4_ * auVar256._8_4_;
  auVar233._12_4_ = auVar46._12_4_ * auVar256._12_4_;
  auVar55 = vsubps_avx512vl(auVar44,auVar233);
  auVar57 = vshufps_avx512vl(auVar54,auVar54,0xff);
  auVar57 = vmulps_avx512vl(auVar57,auVar256);
  auVar158._0_4_ = auVar57._0_4_ + auVar46._0_4_ * fVar224 * auVar39._0_4_ * fVar95;
  auVar158._4_4_ = auVar57._4_4_ + auVar46._4_4_ * fVar224 * auVar39._4_4_ * fVar95;
  auVar158._8_4_ = auVar57._8_4_ + auVar46._8_4_ * fVar224 * auVar39._8_4_ * fVar95;
  auVar158._12_4_ = auVar57._12_4_ + auVar46._12_4_ * fVar224 * auVar39._12_4_ * fVar95;
  auVar39 = vsubps_avx(auVar54,auVar158);
  auVar46 = vaddps_avx512vl(auVar44,auVar233);
  auVar171._0_4_ = auVar56._0_4_ + auVar38._0_4_ * 0.33333334;
  auVar171._4_4_ = auVar56._4_4_ + auVar38._4_4_ * 0.33333334;
  auVar171._8_4_ = auVar56._8_4_ + auVar38._8_4_ * 0.33333334;
  auVar171._12_4_ = auVar56._12_4_ + auVar38._12_4_ * 0.33333334;
  auVar202._0_4_ = auVar39._0_4_ * 0.33333334;
  auVar202._4_4_ = auVar39._4_4_ * 0.33333334;
  auVar202._8_4_ = auVar39._8_4_ * 0.33333334;
  auVar202._12_4_ = auVar39._12_4_ * 0.33333334;
  auVar38 = vsubps_avx(auVar55,auVar202);
  auVar102._0_4_ = auVar47._0_4_ + (fVar209 + auVar101._0_4_) * 0.33333334;
  auVar102._4_4_ = auVar47._4_4_ + (fVar219 + auVar101._4_4_) * 0.33333334;
  auVar102._8_4_ = auVar47._8_4_ + (fVar220 + auVar101._8_4_) * 0.33333334;
  auVar102._12_4_ = auVar47._12_4_ + (fVar221 + auVar101._12_4_) * 0.33333334;
  auVar159._0_4_ = (auVar54._0_4_ + auVar158._0_4_) * 0.33333334;
  auVar159._4_4_ = (auVar54._4_4_ + auVar158._4_4_) * 0.33333334;
  auVar159._8_4_ = (auVar54._8_4_ + auVar158._8_4_) * 0.33333334;
  auVar159._12_4_ = (auVar54._12_4_ + auVar158._12_4_) * 0.33333334;
  auVar39 = vsubps_avx(auVar46,auVar159);
  auVar54 = vbroadcastss_avx512vl(auVar40);
  auVar57 = vsubss_avx512f(ZEXT416(0x3f800000),auVar40);
  auVar257._0_4_ = auVar57._0_4_;
  auVar257._4_4_ = auVar257._0_4_;
  auVar257._8_4_ = auVar257._0_4_;
  auVar257._12_4_ = auVar257._0_4_;
  auVar56 = vmulps_avx512vl(auVar54,auVar56);
  auVar57 = vmulps_avx512vl(auVar54,auVar171);
  auVar38 = vmulps_avx512vl(auVar54,auVar38);
  auVar249._0_4_ = auVar54._0_4_ * auVar55._0_4_;
  auVar249._4_4_ = auVar54._4_4_ * auVar55._4_4_;
  auVar249._8_4_ = auVar54._8_4_ * auVar55._8_4_;
  auVar249._12_4_ = auVar54._12_4_ * auVar55._12_4_;
  local_208 = vfmadd231ps_avx512vl(auVar56,auVar257,auVar50);
  local_218 = vfmadd231ps_avx512vl(auVar57,auVar257,auVar179);
  local_228 = vfmadd231ps_avx512vl(auVar38,auVar257,auVar53);
  local_238 = vfmadd231ps_fma(auVar249,auVar257,auVar52);
  auVar38 = vmulps_avx512vl(auVar54,auVar47);
  auVar47 = vmulps_avx512vl(auVar54,auVar102);
  auVar39 = vmulps_avx512vl(auVar54,auVar39);
  auVar242._0_4_ = auVar54._0_4_ * auVar46._0_4_;
  auVar242._4_4_ = auVar54._4_4_ * auVar46._4_4_;
  auVar242._8_4_ = auVar54._8_4_ * auVar46._8_4_;
  auVar242._12_4_ = auVar54._12_4_ * auVar46._12_4_;
  _local_248 = vfmadd231ps_avx512vl(auVar38,auVar257,auVar51);
  _local_258 = vfmadd231ps_avx512vl(auVar47,auVar257,auVar42);
  _local_268 = vfmadd231ps_avx512vl(auVar39,auVar257,auVar43);
  _local_278 = vfmadd231ps_fma(auVar242,auVar257,auVar41);
  auVar38 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x10)),
                          0x1c);
  auVar38 = vinsertps_avx(auVar38,ZEXT416(*(uint *)(ray + k * 4 + 0x20)),0x28);
  local_188 = vsubps_avx512vl(local_208,auVar38);
  uVar96 = local_188._0_4_;
  auVar103._4_4_ = uVar96;
  auVar103._0_4_ = uVar96;
  auVar103._8_4_ = uVar96;
  auVar103._12_4_ = uVar96;
  auVar39 = vshufps_avx(local_188,local_188,0x55);
  auVar47 = vshufps_avx(local_188,local_188,0xaa);
  aVar3 = pre->ray_space[k].vx.field_0;
  aVar4 = pre->ray_space[k].vy.field_0;
  fVar95 = pre->ray_space[k].vz.field_0.m128[0];
  fVar224 = pre->ray_space[k].vz.field_0.m128[1];
  fVar209 = pre->ray_space[k].vz.field_0.m128[2];
  fVar219 = pre->ray_space[k].vz.field_0.m128[3];
  auVar98._0_4_ = fVar95 * auVar47._0_4_;
  auVar98._4_4_ = fVar224 * auVar47._4_4_;
  auVar98._8_4_ = fVar209 * auVar47._8_4_;
  auVar98._12_4_ = fVar219 * auVar47._12_4_;
  auVar39 = vfmadd231ps_fma(auVar98,(undefined1  [16])aVar4,auVar39);
  auVar51 = vfmadd231ps_fma(auVar39,(undefined1  [16])aVar3,auVar103);
  local_198 = vsubps_avx512vl(local_218,auVar38);
  uVar96 = local_198._0_4_;
  auVar123._4_4_ = uVar96;
  auVar123._0_4_ = uVar96;
  auVar123._8_4_ = uVar96;
  auVar123._12_4_ = uVar96;
  auVar39 = vshufps_avx(local_198,local_198,0x55);
  auVar47 = vshufps_avx(local_198,local_198,0xaa);
  auVar104._0_4_ = fVar95 * auVar47._0_4_;
  auVar104._4_4_ = fVar224 * auVar47._4_4_;
  auVar104._8_4_ = fVar209 * auVar47._8_4_;
  auVar104._12_4_ = fVar219 * auVar47._12_4_;
  auVar39 = vfmadd231ps_fma(auVar104,(undefined1  [16])aVar4,auVar39);
  auVar52 = vfmadd231ps_fma(auVar39,(undefined1  [16])aVar3,auVar123);
  local_1a8 = vsubps_avx512vl(local_228,auVar38);
  uVar96 = local_1a8._0_4_;
  auVar124._4_4_ = uVar96;
  auVar124._0_4_ = uVar96;
  auVar124._8_4_ = uVar96;
  auVar124._12_4_ = uVar96;
  auVar39 = vshufps_avx(local_1a8,local_1a8,0x55);
  auVar47 = vshufps_avx(local_1a8,local_1a8,0xaa);
  auVar190._0_4_ = auVar47._0_4_ * fVar95;
  auVar190._4_4_ = auVar47._4_4_ * fVar224;
  auVar190._8_4_ = auVar47._8_4_ * fVar209;
  auVar190._12_4_ = auVar47._12_4_ * fVar219;
  auVar39 = vfmadd231ps_fma(auVar190,(undefined1  [16])aVar4,auVar39);
  auVar54 = vfmadd231ps_fma(auVar39,(undefined1  [16])aVar3,auVar124);
  local_1b8 = vsubps_avx(local_238,auVar38);
  uVar96 = local_1b8._0_4_;
  auVar125._4_4_ = uVar96;
  auVar125._0_4_ = uVar96;
  auVar125._8_4_ = uVar96;
  auVar125._12_4_ = uVar96;
  auVar39 = vshufps_avx(local_1b8,local_1b8,0x55);
  auVar47 = vshufps_avx(local_1b8,local_1b8,0xaa);
  auVar203._0_4_ = auVar47._0_4_ * fVar95;
  auVar203._4_4_ = auVar47._4_4_ * fVar224;
  auVar203._8_4_ = auVar47._8_4_ * fVar209;
  auVar203._12_4_ = auVar47._12_4_ * fVar219;
  auVar39 = vfmadd231ps_fma(auVar203,(undefined1  [16])aVar4,auVar39);
  auVar55 = vfmadd231ps_fma(auVar39,(undefined1  [16])aVar3,auVar125);
  local_1c8 = vsubps_avx512vl(_local_248,auVar38);
  uVar96 = local_1c8._0_4_;
  auVar126._4_4_ = uVar96;
  auVar126._0_4_ = uVar96;
  auVar126._8_4_ = uVar96;
  auVar126._12_4_ = uVar96;
  auVar39 = vshufps_avx(local_1c8,local_1c8,0x55);
  auVar47 = vshufps_avx(local_1c8,local_1c8,0xaa);
  auVar210._0_4_ = auVar47._0_4_ * fVar95;
  auVar210._4_4_ = auVar47._4_4_ * fVar224;
  auVar210._8_4_ = auVar47._8_4_ * fVar209;
  auVar210._12_4_ = auVar47._12_4_ * fVar219;
  auVar39 = vfmadd231ps_fma(auVar210,(undefined1  [16])aVar4,auVar39);
  auVar56 = vfmadd231ps_fma(auVar39,(undefined1  [16])aVar3,auVar126);
  local_1d8 = vsubps_avx512vl(_local_258,auVar38);
  uVar96 = local_1d8._0_4_;
  auVar127._4_4_ = uVar96;
  auVar127._0_4_ = uVar96;
  auVar127._8_4_ = uVar96;
  auVar127._12_4_ = uVar96;
  auVar39 = vshufps_avx(local_1d8,local_1d8,0x55);
  auVar47 = vshufps_avx(local_1d8,local_1d8,0xaa);
  auVar225._0_4_ = auVar47._0_4_ * fVar95;
  auVar225._4_4_ = auVar47._4_4_ * fVar224;
  auVar225._8_4_ = auVar47._8_4_ * fVar209;
  auVar225._12_4_ = auVar47._12_4_ * fVar219;
  auVar39 = vfmadd231ps_fma(auVar225,(undefined1  [16])aVar4,auVar39);
  auVar57 = vfmadd231ps_fma(auVar39,(undefined1  [16])aVar3,auVar127);
  local_1e8 = vsubps_avx512vl(_local_268,auVar38);
  uVar96 = local_1e8._0_4_;
  auVar128._4_4_ = uVar96;
  auVar128._0_4_ = uVar96;
  auVar128._8_4_ = uVar96;
  auVar128._12_4_ = uVar96;
  auVar39 = vshufps_avx(local_1e8,local_1e8,0x55);
  auVar47 = vshufps_avx(local_1e8,local_1e8,0xaa);
  auVar234._0_4_ = auVar47._0_4_ * fVar95;
  auVar234._4_4_ = auVar47._4_4_ * fVar224;
  auVar234._8_4_ = auVar47._8_4_ * fVar209;
  auVar234._12_4_ = auVar47._12_4_ * fVar219;
  auVar39 = vfmadd231ps_fma(auVar234,(undefined1  [16])aVar4,auVar39);
  auVar58 = vfmadd231ps_fma(auVar39,(undefined1  [16])aVar3,auVar128);
  local_1f8 = vsubps_avx(_local_278,auVar38);
  uVar96 = local_1f8._0_4_;
  auVar114._4_4_ = uVar96;
  auVar114._0_4_ = uVar96;
  auVar114._8_4_ = uVar96;
  auVar114._12_4_ = uVar96;
  auVar38 = vshufps_avx(local_1f8,local_1f8,0x55);
  auVar39 = vshufps_avx(local_1f8,local_1f8,0xaa);
  auVar172._0_4_ = fVar95 * auVar39._0_4_;
  auVar172._4_4_ = fVar224 * auVar39._4_4_;
  auVar172._8_4_ = fVar209 * auVar39._8_4_;
  auVar172._12_4_ = fVar219 * auVar39._12_4_;
  auVar38 = vfmadd231ps_fma(auVar172,(undefined1  [16])aVar4,auVar38);
  auVar59 = vfmadd231ps_fma(auVar38,(undefined1  [16])aVar3,auVar114);
  auVar50 = vmovlhps_avx512f(auVar51,auVar56);
  auVar47 = vmovlhps_avx(auVar52,auVar57);
  auVar46 = vmovlhps_avx(auVar54,auVar58);
  _local_3c8 = vmovlhps_avx(auVar55,auVar59);
  auVar39 = vminps_avx512vl(auVar50,auVar47);
  auVar53 = vmaxps_avx512vl(auVar50,auVar47);
  auVar38 = vminps_avx(auVar46,_local_3c8);
  auVar39 = vminps_avx(auVar39,auVar38);
  auVar38 = vmaxps_avx(auVar46,_local_3c8);
  auVar38 = vmaxps_avx(auVar53,auVar38);
  auVar53 = vshufpd_avx(auVar39,auVar39,3);
  auVar39 = vminps_avx(auVar39,auVar53);
  auVar53 = vshufpd_avx(auVar38,auVar38,3);
  auVar38 = vmaxps_avx(auVar38,auVar53);
  auVar39 = vandps_avx512vl(auVar39,auVar261._0_16_);
  auVar38 = vandps_avx512vl(auVar38,auVar261._0_16_);
  auVar38 = vmaxps_avx(auVar39,auVar38);
  auVar39 = vmovshdup_avx(auVar38);
  auVar38 = vmaxss_avx(auVar39,auVar38);
  local_348 = vmovddup_avx512vl(auVar51);
  local_358 = vmovddup_avx512vl(auVar52);
  local_368._0_8_ = auVar54._0_8_;
  local_368._8_8_ = local_368._0_8_;
  local_378._0_8_ = auVar55._0_8_;
  local_378._8_8_ = local_378._0_8_;
  register0x000012c8 = auVar56._0_8_;
  local_388 = auVar56._0_8_;
  register0x00001308 = auVar57._0_8_;
  local_398 = auVar57._0_8_;
  register0x00001488 = auVar58._0_8_;
  local_3a8 = auVar58._0_8_;
  local_3b8 = auVar59._0_8_;
  register0x00001388 = local_3b8;
  local_3d8 = ZEXT416((uint)(auVar38._0_4_ * 9.536743e-07));
  local_78 = vbroadcastss_avx512vl(local_3d8);
  auVar38 = vxorps_avx512vl(local_78._0_16_,auVar60);
  local_98 = vbroadcastss_avx512vl(auVar38);
  bVar34 = false;
  uVar30 = 0;
  fVar95 = *(float *)(ray + k * 4 + 0x30);
  local_158 = vsubps_avx512vl(auVar47,auVar50);
  local_168 = vsubps_avx(auVar46,auVar47);
  local_178 = vsubps_avx(_local_3c8,auVar46);
  local_2a8 = vsubps_avx512vl(_local_248,local_208);
  local_2b8 = vsubps_avx512vl(_local_258,local_218);
  local_2c8 = vsubps_avx512vl(_local_268,local_228);
  _local_2d8 = vsubps_avx(_local_278,local_238);
  local_2e8 = vpbroadcastd_avx512vl();
  auVar38 = ZEXT816(0x3f80000000000000);
  auVar259 = ZEXT1664(auVar38);
  do {
    auVar263 = ZEXT3264(local_98);
    auVar57 = auVar259._0_16_;
    auVar39 = vshufps_avx(auVar57,auVar57,0x50);
    auVar243._8_4_ = 0x3f800000;
    auVar243._0_8_ = &DAT_3f8000003f800000;
    auVar243._12_4_ = 0x3f800000;
    auVar246._16_4_ = 0x3f800000;
    auVar246._0_16_ = auVar243;
    auVar246._20_4_ = 0x3f800000;
    auVar246._24_4_ = 0x3f800000;
    auVar246._28_4_ = 0x3f800000;
    auVar53 = vsubps_avx(auVar243,auVar39);
    fVar224 = auVar39._0_4_;
    auVar129._0_4_ = local_388._0_4_ * fVar224;
    fVar209 = auVar39._4_4_;
    auVar129._4_4_ = local_388._4_4_ * fVar209;
    fVar219 = auVar39._8_4_;
    auVar129._8_4_ = local_388._8_4_ * fVar219;
    fVar220 = auVar39._12_4_;
    auVar129._12_4_ = local_388._12_4_ * fVar220;
    auVar144._0_4_ = local_398._0_4_ * fVar224;
    auVar144._4_4_ = local_398._4_4_ * fVar209;
    auVar144._8_4_ = local_398._8_4_ * fVar219;
    auVar144._12_4_ = local_398._12_4_ * fVar220;
    auVar160._0_4_ = local_3a8._0_4_ * fVar224;
    auVar160._4_4_ = local_3a8._4_4_ * fVar209;
    auVar160._8_4_ = local_3a8._8_4_ * fVar219;
    auVar160._12_4_ = local_3a8._12_4_ * fVar220;
    auVar105._0_4_ = local_3b8._0_4_ * fVar224;
    auVar105._4_4_ = local_3b8._4_4_ * fVar209;
    auVar105._8_4_ = local_3b8._8_4_ * fVar219;
    auVar105._12_4_ = local_3b8._12_4_ * fVar220;
    auVar52 = vfmadd231ps_avx512vl(auVar129,auVar53,local_348);
    auVar54 = vfmadd231ps_avx512vl(auVar144,auVar53,local_358);
    auVar51 = vfmadd231ps_fma(auVar160,auVar53,local_368);
    auVar53 = vfmadd231ps_fma(auVar105,local_378,auVar53);
    auVar39 = vmovshdup_avx(auVar38);
    fVar209 = auVar38._0_4_;
    fVar224 = (auVar39._0_4_ - fVar209) * 0.04761905;
    auVar135._4_4_ = fVar209;
    auVar135._0_4_ = fVar209;
    auVar135._8_4_ = fVar209;
    auVar135._12_4_ = fVar209;
    auVar135._16_4_ = fVar209;
    auVar135._20_4_ = fVar209;
    auVar135._24_4_ = fVar209;
    auVar135._28_4_ = fVar209;
    auVar72._0_8_ = auVar39._0_8_;
    auVar72._8_8_ = auVar72._0_8_;
    auVar72._16_8_ = auVar72._0_8_;
    auVar72._24_8_ = auVar72._0_8_;
    auVar80 = vsubps_avx(auVar72,auVar135);
    uVar96 = auVar52._0_4_;
    auVar82._4_4_ = uVar96;
    auVar82._0_4_ = uVar96;
    auVar82._8_4_ = uVar96;
    auVar82._12_4_ = uVar96;
    auVar82._16_4_ = uVar96;
    auVar82._20_4_ = uVar96;
    auVar82._24_4_ = uVar96;
    auVar82._28_4_ = uVar96;
    auVar74._8_4_ = 1;
    auVar74._0_8_ = 0x100000001;
    auVar74._12_4_ = 1;
    auVar74._16_4_ = 1;
    auVar74._20_4_ = 1;
    auVar74._24_4_ = 1;
    auVar74._28_4_ = 1;
    auVar78 = ZEXT1632(auVar52);
    auVar76 = vpermps_avx2(auVar74,auVar78);
    auVar62 = vbroadcastss_avx512vl(auVar54);
    auVar79 = ZEXT1632(auVar54);
    auVar63 = vpermps_avx512vl(auVar74,auVar79);
    auVar64 = vbroadcastss_avx512vl(auVar51);
    auVar77 = ZEXT1632(auVar51);
    auVar65 = vpermps_avx512vl(auVar74,auVar77);
    auVar66 = vbroadcastss_avx512vl(auVar53);
    auVar75 = ZEXT1632(auVar53);
    auVar67 = vpermps_avx512vl(auVar74,auVar75);
    auVar207._4_4_ = fVar224;
    auVar207._0_4_ = fVar224;
    auVar207._8_4_ = fVar224;
    auVar207._12_4_ = fVar224;
    auVar207._16_4_ = fVar224;
    auVar207._20_4_ = fVar224;
    auVar207._24_4_ = fVar224;
    auVar207._28_4_ = fVar224;
    auVar73._8_4_ = 2;
    auVar73._0_8_ = 0x200000002;
    auVar73._12_4_ = 2;
    auVar73._16_4_ = 2;
    auVar73._20_4_ = 2;
    auVar73._24_4_ = 2;
    auVar73._28_4_ = 2;
    auVar68 = vpermps_avx512vl(auVar73,auVar78);
    auVar69 = vbroadcastss_avx512vl(ZEXT416(3));
    auVar70 = vpermps_avx512vl(auVar69,auVar78);
    auVar78 = vpermps_avx2(auVar73,auVar79);
    auVar71 = vpermps_avx512vl(auVar69,auVar79);
    auVar79 = vpermps_avx2(auVar73,auVar77);
    auVar72 = vpermps_avx512vl(auVar69,auVar77);
    auVar73 = vpermps_avx512vl(auVar73,auVar75);
    auVar74 = vpermps_avx512vl(auVar69,auVar75);
    auVar39 = vfmadd132ps_fma(auVar80,auVar135,_DAT_02020f20);
    auVar80 = vsubps_avx(auVar246,ZEXT1632(auVar39));
    auVar69 = vmulps_avx512vl(auVar62,ZEXT1632(auVar39));
    auVar77 = ZEXT1632(auVar39);
    auVar75 = vmulps_avx512vl(auVar63,auVar77);
    auVar53 = vfmadd231ps_fma(auVar69,auVar80,auVar82);
    auVar51 = vfmadd231ps_fma(auVar75,auVar80,auVar76);
    auVar69 = vmulps_avx512vl(auVar64,auVar77);
    auVar75 = vmulps_avx512vl(auVar65,auVar77);
    auVar62 = vfmadd231ps_avx512vl(auVar69,auVar80,auVar62);
    auVar63 = vfmadd231ps_avx512vl(auVar75,auVar80,auVar63);
    auVar69 = vmulps_avx512vl(auVar66,auVar77);
    auVar82 = ZEXT1632(auVar39);
    auVar67 = vmulps_avx512vl(auVar67,auVar82);
    auVar64 = vfmadd231ps_avx512vl(auVar69,auVar80,auVar64);
    auVar65 = vfmadd231ps_avx512vl(auVar67,auVar80,auVar65);
    fVar219 = auVar39._0_4_;
    fVar220 = auVar39._4_4_;
    auVar67._4_4_ = fVar220 * auVar62._4_4_;
    auVar67._0_4_ = fVar219 * auVar62._0_4_;
    fVar221 = auVar39._8_4_;
    auVar67._8_4_ = fVar221 * auVar62._8_4_;
    fVar222 = auVar39._12_4_;
    auVar67._12_4_ = fVar222 * auVar62._12_4_;
    auVar67._16_4_ = auVar62._16_4_ * 0.0;
    auVar67._20_4_ = auVar62._20_4_ * 0.0;
    auVar67._24_4_ = auVar62._24_4_ * 0.0;
    auVar67._28_4_ = fVar209;
    auVar69._4_4_ = fVar220 * auVar63._4_4_;
    auVar69._0_4_ = fVar219 * auVar63._0_4_;
    auVar69._8_4_ = fVar221 * auVar63._8_4_;
    auVar69._12_4_ = fVar222 * auVar63._12_4_;
    auVar69._16_4_ = auVar63._16_4_ * 0.0;
    auVar69._20_4_ = auVar63._20_4_ * 0.0;
    auVar69._24_4_ = auVar63._24_4_ * 0.0;
    auVar69._28_4_ = auVar76._28_4_;
    auVar53 = vfmadd231ps_fma(auVar67,auVar80,ZEXT1632(auVar53));
    auVar51 = vfmadd231ps_fma(auVar69,auVar80,ZEXT1632(auVar51));
    auVar81._0_4_ = fVar219 * auVar64._0_4_;
    auVar81._4_4_ = fVar220 * auVar64._4_4_;
    auVar81._8_4_ = fVar221 * auVar64._8_4_;
    auVar81._12_4_ = fVar222 * auVar64._12_4_;
    auVar81._16_4_ = auVar64._16_4_ * 0.0;
    auVar81._20_4_ = auVar64._20_4_ * 0.0;
    auVar81._24_4_ = auVar64._24_4_ * 0.0;
    auVar81._28_4_ = 0;
    auVar75._4_4_ = fVar220 * auVar65._4_4_;
    auVar75._0_4_ = fVar219 * auVar65._0_4_;
    auVar75._8_4_ = fVar221 * auVar65._8_4_;
    auVar75._12_4_ = fVar222 * auVar65._12_4_;
    auVar75._16_4_ = auVar65._16_4_ * 0.0;
    auVar75._20_4_ = auVar65._20_4_ * 0.0;
    auVar75._24_4_ = auVar65._24_4_ * 0.0;
    auVar75._28_4_ = auVar64._28_4_;
    auVar52 = vfmadd231ps_fma(auVar81,auVar80,auVar62);
    auVar54 = vfmadd231ps_fma(auVar75,auVar80,auVar63);
    auVar77._28_4_ = auVar63._28_4_;
    auVar77._0_28_ =
         ZEXT1628(CONCAT412(fVar222 * auVar54._12_4_,
                            CONCAT48(fVar221 * auVar54._8_4_,
                                     CONCAT44(fVar220 * auVar54._4_4_,fVar219 * auVar54._0_4_))));
    auVar55 = vfmadd231ps_fma(ZEXT1632(CONCAT412(fVar222 * auVar52._12_4_,
                                                 CONCAT48(fVar221 * auVar52._8_4_,
                                                          CONCAT44(fVar220 * auVar52._4_4_,
                                                                   fVar219 * auVar52._0_4_)))),
                              auVar80,ZEXT1632(auVar53));
    auVar56 = vfmadd231ps_fma(auVar77,auVar80,ZEXT1632(auVar51));
    auVar76 = vsubps_avx(ZEXT1632(auVar52),ZEXT1632(auVar53));
    auVar62 = vsubps_avx(ZEXT1632(auVar54),ZEXT1632(auVar51));
    auVar63 = vbroadcastss_avx512vl(ZEXT416(0x40400000));
    auVar76 = vmulps_avx512vl(auVar76,auVar63);
    auVar62 = vmulps_avx512vl(auVar62,auVar63);
    auVar147._0_4_ = fVar224 * auVar76._0_4_;
    auVar147._4_4_ = fVar224 * auVar76._4_4_;
    auVar147._8_4_ = fVar224 * auVar76._8_4_;
    auVar147._12_4_ = fVar224 * auVar76._12_4_;
    auVar147._16_4_ = fVar224 * auVar76._16_4_;
    auVar147._20_4_ = fVar224 * auVar76._20_4_;
    auVar147._24_4_ = fVar224 * auVar76._24_4_;
    auVar147._28_4_ = 0;
    auVar76 = vmulps_avx512vl(auVar207,auVar62);
    auVar52 = vxorps_avx512vl(auVar66._0_16_,auVar66._0_16_);
    auVar62 = vpermt2ps_avx512vl(ZEXT1632(auVar55),_DAT_0205fd20,ZEXT1632(auVar52));
    auVar64 = vpermt2ps_avx512vl(ZEXT1632(auVar56),_DAT_0205fd20,ZEXT1632(auVar52));
    auVar111._0_4_ = auVar147._0_4_ + auVar55._0_4_;
    auVar111._4_4_ = auVar147._4_4_ + auVar55._4_4_;
    auVar111._8_4_ = auVar147._8_4_ + auVar55._8_4_;
    auVar111._12_4_ = auVar147._12_4_ + auVar55._12_4_;
    auVar111._16_4_ = auVar147._16_4_ + 0.0;
    auVar111._20_4_ = auVar147._20_4_ + 0.0;
    auVar111._24_4_ = auVar147._24_4_ + 0.0;
    auVar111._28_4_ = 0;
    auVar81 = ZEXT1632(auVar52);
    auVar65 = vpermt2ps_avx512vl(auVar147,_DAT_0205fd20,auVar81);
    auVar66 = vaddps_avx512vl(ZEXT1632(auVar56),auVar76);
    auVar67 = vpermt2ps_avx512vl(auVar76,_DAT_0205fd20,auVar81);
    auVar76 = vsubps_avx(auVar62,auVar65);
    auVar65 = vsubps_avx512vl(auVar64,auVar67);
    auVar67 = vmulps_avx512vl(auVar78,auVar82);
    auVar69 = vmulps_avx512vl(auVar71,auVar82);
    auVar67 = vfmadd231ps_avx512vl(auVar67,auVar80,auVar68);
    auVar69 = vfmadd231ps_avx512vl(auVar69,auVar80,auVar70);
    auVar75 = vmulps_avx512vl(auVar79,auVar82);
    auVar77 = vmulps_avx512vl(auVar72,auVar82);
    auVar78 = vfmadd231ps_avx512vl(auVar75,auVar80,auVar78);
    auVar75 = vfmadd231ps_avx512vl(auVar77,auVar80,auVar71);
    auVar77 = vmulps_avx512vl(auVar73,auVar82);
    auVar68 = vmulps_avx512vl(auVar74,auVar82);
    auVar53 = vfmadd231ps_fma(auVar77,auVar80,auVar79);
    auVar51 = vfmadd231ps_fma(auVar68,auVar80,auVar72);
    auVar77 = vmulps_avx512vl(auVar82,auVar78);
    auVar68 = vmulps_avx512vl(ZEXT1632(auVar39),auVar75);
    auVar67 = vfmadd231ps_avx512vl(auVar77,auVar80,auVar67);
    auVar69 = vfmadd231ps_avx512vl(auVar68,auVar80,auVar69);
    auVar78 = vfmadd231ps_avx512vl
                        (ZEXT1632(CONCAT412(fVar222 * auVar53._12_4_,
                                            CONCAT48(fVar221 * auVar53._8_4_,
                                                     CONCAT44(fVar220 * auVar53._4_4_,
                                                              fVar219 * auVar53._0_4_)))),auVar80,
                         auVar78);
    auVar75 = vfmadd231ps_avx512vl
                        (ZEXT1632(CONCAT412(fVar222 * auVar51._12_4_,
                                            CONCAT48(fVar221 * auVar51._8_4_,
                                                     CONCAT44(fVar220 * auVar51._4_4_,
                                                              fVar219 * auVar51._0_4_)))),auVar80,
                         auVar75);
    auVar68._4_4_ = fVar220 * auVar78._4_4_;
    auVar68._0_4_ = fVar219 * auVar78._0_4_;
    auVar68._8_4_ = fVar221 * auVar78._8_4_;
    auVar68._12_4_ = fVar222 * auVar78._12_4_;
    auVar68._16_4_ = auVar78._16_4_ * 0.0;
    auVar68._20_4_ = auVar78._20_4_ * 0.0;
    auVar68._24_4_ = auVar78._24_4_ * 0.0;
    auVar68._28_4_ = auVar72._28_4_;
    auVar70._4_4_ = fVar220 * auVar75._4_4_;
    auVar70._0_4_ = fVar219 * auVar75._0_4_;
    auVar70._8_4_ = fVar221 * auVar75._8_4_;
    auVar70._12_4_ = fVar222 * auVar75._12_4_;
    auVar70._16_4_ = auVar75._16_4_ * 0.0;
    auVar70._20_4_ = auVar75._20_4_ * 0.0;
    auVar70._24_4_ = auVar75._24_4_ * 0.0;
    auVar70._28_4_ = auVar79._28_4_;
    auVar79 = vfmadd231ps_avx512vl(auVar68,auVar80,auVar67);
    auVar77 = vfmadd231ps_avx512vl(auVar70,auVar69,auVar80);
    auVar80 = vsubps_avx512vl(auVar78,auVar67);
    auVar78 = vsubps_avx512vl(auVar75,auVar69);
    auVar80 = vmulps_avx512vl(auVar80,auVar63);
    auVar78 = vmulps_avx512vl(auVar78,auVar63);
    fVar209 = fVar224 * auVar80._0_4_;
    fVar219 = fVar224 * auVar80._4_4_;
    auVar71._4_4_ = fVar219;
    auVar71._0_4_ = fVar209;
    fVar220 = fVar224 * auVar80._8_4_;
    auVar71._8_4_ = fVar220;
    fVar221 = fVar224 * auVar80._12_4_;
    auVar71._12_4_ = fVar221;
    fVar222 = fVar224 * auVar80._16_4_;
    auVar71._16_4_ = fVar222;
    fVar223 = fVar224 * auVar80._20_4_;
    auVar71._20_4_ = fVar223;
    fVar224 = fVar224 * auVar80._24_4_;
    auVar71._24_4_ = fVar224;
    auVar71._28_4_ = auVar80._28_4_;
    auVar78 = vmulps_avx512vl(auVar207,auVar78);
    auVar63 = vpermt2ps_avx512vl(auVar79,_DAT_0205fd20,auVar81);
    auVar67 = vpermt2ps_avx512vl(auVar77,_DAT_0205fd20,auVar81);
    auVar208._0_4_ = auVar79._0_4_ + fVar209;
    auVar208._4_4_ = auVar79._4_4_ + fVar219;
    auVar208._8_4_ = auVar79._8_4_ + fVar220;
    auVar208._12_4_ = auVar79._12_4_ + fVar221;
    auVar208._16_4_ = auVar79._16_4_ + fVar222;
    auVar208._20_4_ = auVar79._20_4_ + fVar223;
    auVar208._24_4_ = auVar79._24_4_ + fVar224;
    auVar208._28_4_ = auVar79._28_4_ + auVar80._28_4_;
    auVar80 = vpermt2ps_avx512vl(auVar71,_DAT_0205fd20,ZEXT1632(auVar52));
    auVar69 = vaddps_avx512vl(auVar77,auVar78);
    auVar78 = vpermt2ps_avx512vl(auVar78,_DAT_0205fd20,ZEXT1632(auVar52));
    auVar80 = vsubps_avx(auVar63,auVar80);
    auVar78 = vsubps_avx512vl(auVar67,auVar78);
    auVar135 = ZEXT1632(auVar55);
    auVar75 = vsubps_avx512vl(auVar79,auVar135);
    auVar147 = ZEXT1632(auVar56);
    auVar68 = vsubps_avx512vl(auVar77,auVar147);
    auVar70 = vsubps_avx512vl(auVar63,auVar62);
    auVar75 = vaddps_avx512vl(auVar75,auVar70);
    auVar70 = vsubps_avx512vl(auVar67,auVar64);
    auVar68 = vaddps_avx512vl(auVar68,auVar70);
    auVar70 = vmulps_avx512vl(auVar147,auVar75);
    auVar70 = vfnmadd231ps_avx512vl(auVar70,auVar135,auVar68);
    auVar71 = vmulps_avx512vl(auVar66,auVar75);
    auVar71 = vfnmadd231ps_avx512vl(auVar71,auVar111,auVar68);
    auVar72 = vmulps_avx512vl(auVar65,auVar75);
    auVar72 = vfnmadd231ps_avx512vl(auVar72,auVar76,auVar68);
    auVar73 = vmulps_avx512vl(auVar64,auVar75);
    auVar73 = vfnmadd231ps_avx512vl(auVar73,auVar62,auVar68);
    auVar74 = vmulps_avx512vl(auVar77,auVar75);
    auVar74 = vfnmadd231ps_avx512vl(auVar74,auVar79,auVar68);
    auVar81 = vmulps_avx512vl(auVar69,auVar75);
    auVar81 = vfnmadd231ps_avx512vl(auVar81,auVar208,auVar68);
    auVar82 = vmulps_avx512vl(auVar78,auVar75);
    auVar82 = vfnmadd231ps_avx512vl(auVar82,auVar80,auVar68);
    auVar75 = vmulps_avx512vl(auVar67,auVar75);
    auVar75 = vfnmadd231ps_avx512vl(auVar75,auVar63,auVar68);
    auVar68 = vminps_avx512vl(auVar70,auVar71);
    auVar70 = vmaxps_avx512vl(auVar70,auVar71);
    auVar71 = vminps_avx512vl(auVar72,auVar73);
    auVar68 = vminps_avx512vl(auVar68,auVar71);
    auVar71 = vmaxps_avx512vl(auVar72,auVar73);
    auVar70 = vmaxps_avx512vl(auVar70,auVar71);
    auVar71 = vminps_avx512vl(auVar74,auVar81);
    auVar72 = vmaxps_avx512vl(auVar74,auVar81);
    auVar73 = vminps_avx512vl(auVar82,auVar75);
    auVar71 = vminps_avx512vl(auVar71,auVar73);
    auVar68 = vminps_avx512vl(auVar68,auVar71);
    auVar75 = vmaxps_avx512vl(auVar82,auVar75);
    auVar75 = vmaxps_avx512vl(auVar72,auVar75);
    auVar75 = vmaxps_avx512vl(auVar70,auVar75);
    uVar16 = vcmpps_avx512vl(auVar68,local_78,2);
    uVar17 = vcmpps_avx512vl(auVar75,local_98,5);
    uVar33 = 0;
    bVar25 = (byte)uVar16 & (byte)uVar17 & 0x7f;
    if (bVar25 != 0) {
      auVar75 = vsubps_avx512vl(auVar62,auVar135);
      auVar68 = vsubps_avx512vl(auVar64,auVar147);
      auVar70 = vsubps_avx512vl(auVar63,auVar79);
      auVar75 = vaddps_avx512vl(auVar75,auVar70);
      auVar70 = vsubps_avx512vl(auVar67,auVar77);
      auVar68 = vaddps_avx512vl(auVar68,auVar70);
      auVar70 = vmulps_avx512vl(auVar147,auVar75);
      auVar70 = vfnmadd231ps_avx512vl(auVar70,auVar68,auVar135);
      auVar66 = vmulps_avx512vl(auVar66,auVar75);
      auVar66 = vfnmadd213ps_avx512vl(auVar111,auVar68,auVar66);
      auVar65 = vmulps_avx512vl(auVar65,auVar75);
      auVar65 = vfnmadd213ps_avx512vl(auVar76,auVar68,auVar65);
      auVar76 = vmulps_avx512vl(auVar64,auVar75);
      auVar64 = vfnmadd231ps_avx512vl(auVar76,auVar68,auVar62);
      auVar76 = vmulps_avx512vl(auVar77,auVar75);
      auVar79 = vfnmadd231ps_avx512vl(auVar76,auVar68,auVar79);
      auVar76 = vmulps_avx512vl(auVar69,auVar75);
      auVar69 = vfnmadd213ps_avx512vl(auVar208,auVar68,auVar76);
      auVar76 = vmulps_avx512vl(auVar78,auVar75);
      auVar77 = vfnmadd213ps_avx512vl(auVar80,auVar68,auVar76);
      auVar80 = vmulps_avx512vl(auVar67,auVar75);
      auVar63 = vfnmadd231ps_avx512vl(auVar80,auVar63,auVar68);
      auVar76 = vminps_avx(auVar70,auVar66);
      auVar80 = vmaxps_avx(auVar70,auVar66);
      auVar62 = vminps_avx(auVar65,auVar64);
      auVar62 = vminps_avx(auVar76,auVar62);
      auVar76 = vmaxps_avx(auVar65,auVar64);
      auVar80 = vmaxps_avx(auVar80,auVar76);
      auVar78 = vminps_avx(auVar79,auVar69);
      auVar76 = vmaxps_avx(auVar79,auVar69);
      auVar79 = vminps_avx(auVar77,auVar63);
      auVar78 = vminps_avx(auVar78,auVar79);
      auVar78 = vminps_avx(auVar62,auVar78);
      auVar62 = vmaxps_avx(auVar77,auVar63);
      auVar76 = vmaxps_avx(auVar76,auVar62);
      auVar80 = vmaxps_avx(auVar80,auVar76);
      uVar16 = vcmpps_avx512vl(auVar80,local_98,5);
      uVar17 = vcmpps_avx512vl(auVar78,local_78,2);
      uVar33 = (uint)(bVar25 & (byte)uVar16 & (byte)uVar17);
    }
    if (uVar33 != 0) {
      auStack_338[uVar30] = uVar33;
      uVar16 = vmovlps_avx(auVar38);
      *(undefined8 *)(&uStack_148 + uVar30 * 2) = uVar16;
      uVar37 = vmovlps_avx(auVar57);
      auStack_58[uVar30] = uVar37;
      uVar30 = (ulong)((int)uVar30 + 1);
    }
    auVar38 = vbroadcastss_avx512vl(ZEXT416(0x40400000));
    auVar260 = ZEXT1664(auVar38);
    auVar80 = vbroadcastss_avx512vl(ZEXT416(0x40400000));
    in_ZMM17 = ZEXT3264(auVar80);
    in_ZMM22 = ZEXT464(0x38d1b717);
    do {
      in_ZMM18 = ZEXT464(0x3e124925);
      auVar51 = auVar265._0_16_;
      auVar53 = auVar260._0_16_;
      auVar38 = SUB6416(ZEXT464(0xb8d1b717),0);
      auVar39 = SUB6416(ZEXT464(0x38d1b717),0);
      if ((int)uVar30 == 0) {
        if (bVar34) {
          return local_489;
        }
        uVar96 = *(undefined4 *)(ray + k * 4 + 0x80);
        auVar22._4_4_ = uVar96;
        auVar22._0_4_ = uVar96;
        auVar22._8_4_ = uVar96;
        auVar22._12_4_ = uVar96;
        uVar16 = vcmpps_avx512vl(local_288,auVar22,2);
        uVar33 = (uint)uVar36 & (uint)uVar36 + 0xf & (uint)uVar16;
        uVar36 = (ulong)uVar33;
        local_489 = uVar33 != 0;
        if (!local_489) {
          return local_489;
        }
        goto LAB_01c221ab;
      }
      uVar26 = (int)uVar30 - 1;
      uVar28 = (ulong)uVar26;
      uVar33 = (&uStack_148)[uVar28 * 2];
      fVar224 = afStack_144[uVar28 * 2];
      uVar6 = auStack_338[uVar28];
      auVar258._8_8_ = 0;
      auVar258._0_8_ = auStack_58[uVar28];
      auVar259 = ZEXT1664(auVar258);
      lVar31 = 0;
      for (uVar37 = (ulong)uVar6; (uVar37 & 1) == 0; uVar37 = uVar37 >> 1 | 0x8000000000000000) {
        lVar31 = lVar31 + 1;
      }
      uVar29 = uVar6 - 1 & uVar6;
      auStack_338[uVar28] = uVar29;
      if (uVar29 == 0) {
        uVar30 = (ulong)uVar26;
      }
      auVar54 = vpxord_avx512vl(auVar263._0_16_,auVar263._0_16_);
      auVar52 = vcvtsi2ss_avx512f(auVar54,lVar31);
      auVar55 = vmulss_avx512f(auVar52,in_ZMM18._0_16_);
      lVar31 = lVar31 + 1;
      auVar52 = vpxord_avx512vl(auVar54,auVar54);
      auVar52 = vcvtsi2ss_avx512f(auVar52,lVar31);
      auVar52 = vmulss_avx512f(auVar52,in_ZMM18._0_16_);
      auVar56 = auVar262._0_16_;
      auVar54 = vsubss_avx512f(auVar56,auVar55);
      auVar55 = vmulss_avx512f(ZEXT416((uint)fVar224),auVar55);
      auVar54 = vfmadd231ss_avx512f(auVar55,ZEXT416(uVar33),auVar54);
      auVar55 = vsubss_avx512f(auVar56,auVar52);
      auVar52 = vfmadd231ss_fma(ZEXT416((uint)(fVar224 * auVar52._0_4_)),ZEXT416(uVar33),auVar55);
      auVar55 = vsubss_avx512f(auVar52,auVar54);
      vucomiss_avx512f(auVar55);
      if (uVar6 == 0 || lVar31 == 0) break;
      auVar263 = ZEXT1664(auVar258);
      auVar57 = vshufps_avx(auVar258,auVar258,0x50);
      vucomiss_avx512f(auVar55);
      uVar33 = (uint)uVar30;
      auVar115._8_4_ = 0x3f800000;
      auVar115._0_8_ = &DAT_3f8000003f800000;
      auVar115._12_4_ = 0x3f800000;
      auVar58 = vsubps_avx(auVar115,auVar57);
      fVar224 = auVar57._0_4_;
      auVar130._0_4_ = fVar224 * (float)local_388._0_4_;
      fVar209 = auVar57._4_4_;
      auVar130._4_4_ = fVar209 * (float)local_388._4_4_;
      fVar219 = auVar57._8_4_;
      auVar130._8_4_ = fVar219 * fStack_380;
      fVar220 = auVar57._12_4_;
      auVar130._12_4_ = fVar220 * fStack_37c;
      auVar145._0_4_ = fVar224 * (float)local_398._0_4_;
      auVar145._4_4_ = fVar209 * (float)local_398._4_4_;
      auVar145._8_4_ = fVar219 * fStack_390;
      auVar145._12_4_ = fVar220 * fStack_38c;
      auVar161._0_4_ = fVar224 * (float)local_3a8._0_4_;
      auVar161._4_4_ = fVar209 * (float)local_3a8._4_4_;
      auVar161._8_4_ = fVar219 * fStack_3a0;
      auVar161._12_4_ = fVar220 * fStack_39c;
      auVar106._0_4_ = fVar224 * (float)local_3b8._0_4_;
      auVar106._4_4_ = fVar209 * (float)local_3b8._4_4_;
      auVar106._8_4_ = fVar219 * fStack_3b0;
      auVar106._12_4_ = fVar220 * fStack_3ac;
      auVar57 = vfmadd231ps_fma(auVar130,auVar58,local_348);
      auVar59 = vfmadd231ps_fma(auVar145,auVar58,local_358);
      auVar60 = vfmadd231ps_fma(auVar161,auVar58,local_368);
      auVar58 = vfmadd231ps_fma(auVar106,auVar58,local_378);
      auVar120._16_16_ = auVar57;
      auVar120._0_16_ = auVar57;
      auVar136._16_16_ = auVar59;
      auVar136._0_16_ = auVar59;
      auVar148._16_16_ = auVar60;
      auVar148._0_16_ = auVar60;
      auVar57 = vbroadcastss_avx512vl(auVar54);
      uVar96 = auVar52._0_4_;
      auVar176._20_4_ = uVar96;
      auVar176._16_4_ = uVar96;
      auVar176._24_4_ = uVar96;
      auVar176._28_4_ = uVar96;
      auVar176._0_16_ = auVar57;
      auVar80 = vsubps_avx(auVar136,auVar120);
      auVar59 = vfmadd213ps_fma(auVar80,auVar176,auVar120);
      auVar80 = vsubps_avx(auVar148,auVar136);
      auVar40 = vfmadd213ps_fma(auVar80,auVar176,auVar136);
      auVar57 = vsubps_avx(auVar58,auVar60);
      auVar137._16_16_ = auVar57;
      auVar137._0_16_ = auVar57;
      auVar57 = vfmadd213ps_fma(auVar137,auVar176,auVar148);
      auVar80 = vsubps_avx(ZEXT1632(auVar40),ZEXT1632(auVar59));
      auVar58 = vfmadd213ps_fma(auVar80,auVar176,ZEXT1632(auVar59));
      auVar80 = vsubps_avx(ZEXT1632(auVar57),ZEXT1632(auVar40));
      auVar57 = vfmadd213ps_fma(auVar80,auVar176,ZEXT1632(auVar40));
      auVar80 = vsubps_avx(ZEXT1632(auVar57),ZEXT1632(auVar58));
      auVar112 = vfmadd231ps_fma(ZEXT1632(auVar58),auVar80,auVar176);
      auVar80 = vmulps_avx512vl(auVar80,in_ZMM17._0_32_);
      auVar57 = vmulss_avx512f(auVar55,SUB6416(ZEXT464(0x3eaaaaab),0));
      fVar224 = auVar57._0_4_;
      auVar162._0_8_ =
           CONCAT44(auVar112._4_4_ + fVar224 * auVar80._4_4_,
                    auVar112._0_4_ + fVar224 * auVar80._0_4_);
      auVar162._8_4_ = auVar112._8_4_ + fVar224 * auVar80._8_4_;
      auVar162._12_4_ = auVar112._12_4_ + fVar224 * auVar80._12_4_;
      auVar131._0_4_ = fVar224 * auVar80._16_4_;
      auVar131._4_4_ = fVar224 * auVar80._20_4_;
      auVar131._8_4_ = fVar224 * auVar80._24_4_;
      auVar131._12_4_ = fVar224 * auVar80._28_4_;
      auVar49 = vsubps_avx((undefined1  [16])0x0,auVar131);
      auVar42 = vshufpd_avx(auVar112,auVar112,3);
      auVar43 = vshufpd_avx((undefined1  [16])0x0,(undefined1  [16])0x0,3);
      auVar57 = vsubps_avx(auVar42,auVar112);
      auVar58 = vsubps_avx(auVar43,(undefined1  [16])0x0);
      auVar180._0_4_ = auVar58._0_4_ + auVar57._0_4_;
      auVar180._4_4_ = auVar58._4_4_ + auVar57._4_4_;
      auVar180._8_4_ = auVar58._8_4_ + auVar57._8_4_;
      auVar180._12_4_ = auVar58._12_4_ + auVar57._12_4_;
      auVar57 = vshufps_avx(auVar112,auVar112,0xb1);
      auVar58 = vshufps_avx(auVar162,auVar162,0xb1);
      auVar59 = vshufps_avx(auVar49,auVar49,0xb1);
      auVar60 = vshufps_avx((undefined1  [16])0x0,(undefined1  [16])0x0,0xb1);
      auVar235._4_4_ = auVar180._0_4_;
      auVar235._0_4_ = auVar180._0_4_;
      auVar235._8_4_ = auVar180._0_4_;
      auVar235._12_4_ = auVar180._0_4_;
      auVar40 = vshufps_avx(auVar180,auVar180,0x55);
      fVar224 = auVar40._0_4_;
      auVar191._0_4_ = auVar57._0_4_ * fVar224;
      fVar209 = auVar40._4_4_;
      auVar191._4_4_ = auVar57._4_4_ * fVar209;
      fVar219 = auVar40._8_4_;
      auVar191._8_4_ = auVar57._8_4_ * fVar219;
      fVar220 = auVar40._12_4_;
      auVar191._12_4_ = auVar57._12_4_ * fVar220;
      auVar204._0_4_ = auVar58._0_4_ * fVar224;
      auVar204._4_4_ = auVar58._4_4_ * fVar209;
      auVar204._8_4_ = auVar58._8_4_ * fVar219;
      auVar204._12_4_ = auVar58._12_4_ * fVar220;
      auVar211._0_4_ = auVar59._0_4_ * fVar224;
      auVar211._4_4_ = auVar59._4_4_ * fVar209;
      auVar211._8_4_ = auVar59._8_4_ * fVar219;
      auVar211._12_4_ = auVar59._12_4_ * fVar220;
      auVar181._0_4_ = auVar60._0_4_ * fVar224;
      auVar181._4_4_ = auVar60._4_4_ * fVar209;
      auVar181._8_4_ = auVar60._8_4_ * fVar219;
      auVar181._12_4_ = auVar60._12_4_ * fVar220;
      auVar57 = vfmadd231ps_fma(auVar191,auVar235,auVar112);
      auVar58 = vfmadd231ps_fma(auVar204,auVar235,auVar162);
      auVar40 = vfmadd231ps_fma(auVar211,auVar235,auVar49);
      auVar61 = vfmadd231ps_fma(auVar181,(undefined1  [16])0x0,auVar235);
      auVar41 = vshufpd_avx(auVar57,auVar57,1);
      auVar44 = vshufpd_avx(auVar58,auVar58,1);
      auVar45 = vshufpd_avx(auVar40,auVar40,1);
      auVar48 = vshufpd_avx(auVar61,auVar61,1);
      auVar59 = vminss_avx(auVar57,auVar58);
      auVar57 = vmaxss_avx(auVar58,auVar57);
      auVar60 = vminss_avx(auVar40,auVar61);
      auVar58 = vmaxss_avx(auVar61,auVar40);
      auVar60 = vminss_avx(auVar59,auVar60);
      auVar57 = vmaxss_avx(auVar58,auVar57);
      auVar40 = vminss_avx(auVar41,auVar44);
      auVar58 = vmaxss_avx(auVar44,auVar41);
      auVar41 = vminss_avx(auVar45,auVar48);
      auVar59 = vmaxss_avx(auVar48,auVar45);
      auVar40 = vminss_avx(auVar40,auVar41);
      auVar58 = vmaxss_avx(auVar59,auVar58);
      auVar59 = vucomiss_avx512f(auVar60);
      in_ZMM22 = ZEXT1664(auVar59);
      if ((uVar33 < 5) || (auVar58 = vucomiss_avx512f(auVar38), uVar33 < 5)) {
        auVar57 = vucomiss_avx512f(auVar38);
        uVar16 = vcmpps_avx512vl(auVar40,auVar39,1);
        uVar17 = vcmpps_avx512vl(auVar60,auVar39,1);
        if ((4 < uVar33 & ((byte)uVar17 | (byte)uVar16)) != 0) goto LAB_01c2345f;
        uVar16 = vcmpps_avx512vl(auVar38,auVar58,5);
        uVar17 = vcmpps_avx512vl(auVar40,auVar39,5);
        if ((((ushort)uVar17 | (ushort)uVar16) & 1) == 0) goto LAB_01c2345f;
        bVar18 = true;
        auVar259 = ZEXT1664(auVar258);
      }
      else {
LAB_01c2345f:
        uVar16 = vcmpss_avx512f(auVar60,auVar51,1);
        bVar18 = (bool)((byte)uVar16 & 1);
        iVar94 = auVar262._0_4_;
        fVar224 = (float)((uint)bVar18 * -0x40800000 + (uint)!bVar18 * iVar94);
        uVar16 = vcmpss_avx512f(auVar57,auVar51,1);
        bVar18 = (bool)((byte)uVar16 & 1);
        fVar209 = (float)((uint)bVar18 * -0x40800000 + (uint)!bVar18 * iVar94);
        bVar18 = fVar224 != fVar209;
        iVar264 = auVar265._0_4_;
        auVar80._0_16_ = SUB6416(ZEXT464(0x7f800000),0);
        auVar83._4_28_ = auVar80._4_28_;
        auVar83._0_4_ = (uint)bVar18 * iVar264 + (uint)!bVar18 * 0x7f800000;
        auVar39 = auVar83._0_16_;
        auVar85._16_16_ = auVar80._16_16_;
        auVar85._0_16_ = SUB6416(ZEXT464(0xff800000),0);
        auVar84._4_28_ = auVar85._4_28_;
        auVar84._0_4_ = (uint)bVar18 * iVar264 + (uint)!bVar18 * -0x800000;
        auVar38 = auVar84._0_16_;
        uVar16 = vcmpss_avx512f(auVar40,auVar51,1);
        bVar18 = (bool)((byte)uVar16 & 1);
        fVar219 = (float)((uint)bVar18 * -0x40800000 + (uint)!bVar18 * iVar94);
        if ((fVar224 != fVar219) || (NAN(fVar224) || NAN(fVar219))) {
          fVar220 = auVar40._0_4_;
          fVar224 = auVar60._0_4_;
          bVar18 = fVar220 == fVar224;
          if ((!bVar18) || (NAN(fVar220) || NAN(fVar224))) {
            auVar21._8_4_ = 0x80000000;
            auVar21._0_8_ = 0x8000000080000000;
            auVar21._12_4_ = 0x80000000;
            auVar59 = vxorps_avx512vl(auVar60,auVar21);
            auVar250._0_4_ = auVar59._0_4_ / (fVar220 - fVar224);
            auVar250._4_12_ = auVar59._4_12_;
            auVar59 = vsubss_avx512f(auVar56,auVar250);
            auVar60 = vfmadd213ss_avx512f(auVar59,auVar51,auVar250);
            auVar59 = auVar60;
          }
          else {
            vucomiss_avx512f(auVar51);
            auVar87._16_16_ = auVar80._16_16_;
            auVar87._0_16_ = SUB6416(ZEXT464(0x7f800000),0);
            auVar86._4_28_ = auVar87._4_28_;
            auVar86._0_4_ = (uint)bVar18 * iVar264 + (uint)!bVar18 * 0x7f800000;
            auVar60 = auVar86._0_16_;
            auVar59 = ZEXT416((uint)bVar18 * 0x3f800000 + (uint)!bVar18 * -0x800000);
          }
          auVar39 = vminss_avx(auVar39,auVar60);
          auVar38 = vmaxss_avx(auVar59,auVar38);
        }
        auVar259 = ZEXT1664(auVar258);
        uVar16 = vcmpss_avx512f(auVar58,auVar51,1);
        bVar18 = (bool)((byte)uVar16 & 1);
        fVar224 = (float)((uint)bVar18 * -0x40800000 + (uint)!bVar18 * iVar94);
        if ((fVar209 != fVar224) || (NAN(fVar209) || NAN(fVar224))) {
          fVar220 = auVar58._0_4_;
          fVar209 = auVar57._0_4_;
          bVar18 = fVar220 == fVar209;
          if ((!bVar18) || (NAN(fVar220) || NAN(fVar209))) {
            auVar20._8_4_ = 0x80000000;
            auVar20._0_8_ = 0x8000000080000000;
            auVar20._12_4_ = 0x80000000;
            auVar57 = vxorps_avx512vl(auVar57,auVar20);
            auVar212._0_4_ = auVar57._0_4_ / (fVar220 - fVar209);
            auVar212._4_12_ = auVar57._4_12_;
            auVar57 = vsubss_avx512f(auVar56,auVar212);
            auVar58 = vfmadd213ss_avx512f(auVar57,auVar51,auVar212);
            auVar57 = auVar58;
          }
          else {
            vucomiss_avx512f(auVar51);
            auVar89._16_16_ = auVar80._16_16_;
            auVar89._0_16_ = SUB6416(ZEXT464(0x7f800000),0);
            auVar88._4_28_ = auVar89._4_28_;
            auVar88._0_4_ = (uint)bVar18 * iVar264 + (uint)!bVar18 * 0x7f800000;
            auVar58 = auVar88._0_16_;
            auVar57 = ZEXT416((uint)bVar18 * 0x3f800000 + (uint)!bVar18 * -0x800000);
          }
          auVar39 = vminss_avx(auVar39,auVar58);
          auVar38 = vmaxss_avx(auVar57,auVar38);
        }
        bVar18 = fVar219 != fVar224;
        auVar57 = vminss_avx512f(auVar39,auVar56);
        auVar91._16_16_ = auVar80._16_16_;
        auVar91._0_16_ = auVar39;
        auVar90._4_28_ = auVar91._4_28_;
        auVar90._0_4_ = (uint)bVar18 * auVar57._0_4_ + (uint)!bVar18 * auVar39._0_4_;
        auVar39 = vmaxss_avx512f(auVar56,auVar38);
        auVar93._16_16_ = auVar80._16_16_;
        auVar93._0_16_ = auVar38;
        auVar92._4_28_ = auVar93._4_28_;
        auVar92._0_4_ = (uint)bVar18 * auVar39._0_4_ + (uint)!bVar18 * auVar38._0_4_;
        auVar38 = vmaxss_avx512f(auVar51,auVar90._0_16_);
        auVar39 = vminss_avx512f(auVar92._0_16_,auVar56);
        bVar18 = true;
        if (auVar38._0_4_ <= auVar39._0_4_) {
          auVar44 = vmaxss_avx512f(auVar51,ZEXT416((uint)(auVar38._0_4_ + -0.1)));
          auVar45 = vminss_avx512f(ZEXT416((uint)(auVar39._0_4_ + 0.1)),auVar56);
          auVar107._0_8_ = auVar112._0_8_;
          auVar107._8_8_ = auVar107._0_8_;
          auVar205._8_8_ = auVar162._0_8_;
          auVar205._0_8_ = auVar162._0_8_;
          auVar213._8_8_ = auVar49._0_8_;
          auVar213._0_8_ = auVar49._0_8_;
          auVar38 = vshufpd_avx(auVar162,auVar162,3);
          auVar39 = vshufpd_avx(auVar49,auVar49,3);
          auVar57 = vshufps_avx(auVar44,auVar45,0);
          auVar236._8_4_ = 0x3f800000;
          auVar236._0_8_ = &DAT_3f8000003f800000;
          auVar236._12_4_ = 0x3f800000;
          auVar58 = vsubps_avx(auVar236,auVar57);
          fVar224 = auVar57._0_4_;
          auVar244._0_4_ = fVar224 * auVar42._0_4_;
          fVar209 = auVar57._4_4_;
          auVar244._4_4_ = fVar209 * auVar42._4_4_;
          fVar219 = auVar57._8_4_;
          auVar244._8_4_ = fVar219 * auVar42._8_4_;
          fVar220 = auVar57._12_4_;
          auVar244._12_4_ = fVar220 * auVar42._12_4_;
          auVar163._0_4_ = fVar224 * auVar38._0_4_;
          auVar163._4_4_ = fVar209 * auVar38._4_4_;
          auVar163._8_4_ = fVar219 * auVar38._8_4_;
          auVar163._12_4_ = fVar220 * auVar38._12_4_;
          auVar173._0_4_ = fVar224 * auVar39._0_4_;
          auVar173._4_4_ = fVar209 * auVar39._4_4_;
          auVar173._8_4_ = fVar219 * auVar39._8_4_;
          auVar173._12_4_ = fVar220 * auVar39._12_4_;
          auVar132._0_4_ = fVar224 * auVar43._0_4_;
          auVar132._4_4_ = fVar209 * auVar43._4_4_;
          auVar132._8_4_ = fVar219 * auVar43._8_4_;
          auVar132._12_4_ = fVar220 * auVar43._12_4_;
          auVar59 = vfmadd231ps_fma(auVar244,auVar58,auVar107);
          auVar60 = vfmadd231ps_fma(auVar163,auVar58,auVar205);
          auVar40 = vfmadd231ps_fma(auVar173,auVar58,auVar213);
          auVar41 = vfmadd231ps_fma(auVar132,auVar58,ZEXT816(0));
          auVar39 = vsubss_avx512f(auVar56,auVar44);
          auVar38 = vmovshdup_avx(auVar258);
          auVar48 = vfmadd231ss_fma(ZEXT416((uint)(auVar38._0_4_ * auVar44._0_4_)),auVar258,auVar39)
          ;
          auVar39 = vsubss_avx512f(auVar56,auVar45);
          auVar49 = vfmadd231ss_fma(ZEXT416((uint)(auVar45._0_4_ * auVar38._0_4_)),auVar258,auVar39)
          ;
          auVar58 = vdivss_avx512f(auVar56,auVar55);
          auVar38 = vsubps_avx(auVar60,auVar59);
          auVar55 = vmulps_avx512vl(auVar38,auVar53);
          auVar38 = vsubps_avx(auVar40,auVar60);
          auVar57 = vmulps_avx512vl(auVar38,auVar53);
          auVar38 = vsubps_avx(auVar41,auVar40);
          auVar38 = vmulps_avx512vl(auVar38,auVar53);
          auVar39 = vminps_avx(auVar57,auVar38);
          auVar38 = vmaxps_avx(auVar57,auVar38);
          auVar39 = vminps_avx(auVar55,auVar39);
          auVar38 = vmaxps_avx(auVar55,auVar38);
          auVar55 = vshufpd_avx(auVar39,auVar39,3);
          auVar57 = vshufpd_avx(auVar38,auVar38,3);
          auVar39 = vminps_avx(auVar39,auVar55);
          auVar38 = vmaxps_avx(auVar38,auVar57);
          fVar224 = auVar58._0_4_;
          auVar192._0_4_ = fVar224 * auVar39._0_4_;
          auVar192._4_4_ = fVar224 * auVar39._4_4_;
          auVar192._8_4_ = fVar224 * auVar39._8_4_;
          auVar192._12_4_ = fVar224 * auVar39._12_4_;
          auVar182._0_4_ = fVar224 * auVar38._0_4_;
          auVar182._4_4_ = fVar224 * auVar38._4_4_;
          auVar182._8_4_ = fVar224 * auVar38._8_4_;
          auVar182._12_4_ = fVar224 * auVar38._12_4_;
          auVar42 = vdivss_avx512f(auVar56,ZEXT416((uint)(auVar49._0_4_ - auVar48._0_4_)));
          auVar38 = vshufpd_avx(auVar59,auVar59,3);
          auVar39 = vshufpd_avx(auVar60,auVar60,3);
          auVar55 = vshufpd_avx(auVar40,auVar40,3);
          auVar57 = vshufpd_avx(auVar41,auVar41,3);
          auVar38 = vsubps_avx(auVar38,auVar59);
          auVar58 = vsubps_avx(auVar39,auVar60);
          auVar59 = vsubps_avx(auVar55,auVar40);
          auVar57 = vsubps_avx(auVar57,auVar41);
          auVar39 = vminps_avx(auVar38,auVar58);
          auVar38 = vmaxps_avx(auVar38,auVar58);
          auVar55 = vminps_avx(auVar59,auVar57);
          auVar55 = vminps_avx(auVar39,auVar55);
          auVar39 = vmaxps_avx(auVar59,auVar57);
          auVar38 = vmaxps_avx(auVar38,auVar39);
          fVar224 = auVar42._0_4_;
          auVar214._0_4_ = fVar224 * auVar55._0_4_;
          auVar214._4_4_ = fVar224 * auVar55._4_4_;
          auVar214._8_4_ = fVar224 * auVar55._8_4_;
          auVar214._12_4_ = fVar224 * auVar55._12_4_;
          auVar226._0_4_ = fVar224 * auVar38._0_4_;
          auVar226._4_4_ = fVar224 * auVar38._4_4_;
          auVar226._8_4_ = fVar224 * auVar38._8_4_;
          auVar226._12_4_ = fVar224 * auVar38._12_4_;
          auVar45 = vinsertps_avx512f(auVar54,auVar48,0x10);
          auVar58 = vinsertps_avx(auVar52,auVar49,0x10);
          auVar99._0_4_ = auVar45._0_4_ + auVar58._0_4_;
          auVar99._4_4_ = auVar45._4_4_ + auVar58._4_4_;
          auVar99._8_4_ = auVar45._8_4_ + auVar58._8_4_;
          auVar99._12_4_ = auVar45._12_4_ + auVar58._12_4_;
          auVar19._8_4_ = 0x3f000000;
          auVar19._0_8_ = 0x3f0000003f000000;
          auVar19._12_4_ = 0x3f000000;
          auVar43 = vmulps_avx512vl(auVar99,auVar19);
          auVar55 = vshufps_avx(auVar43,auVar43,0x54);
          uVar96 = auVar43._0_4_;
          auVar116._4_4_ = uVar96;
          auVar116._0_4_ = uVar96;
          auVar116._8_4_ = uVar96;
          auVar116._12_4_ = uVar96;
          auVar57 = vfmadd213ps_avx512vl(local_158,auVar116,auVar50);
          auVar59 = vfmadd213ps_avx512vl(local_168,auVar116,auVar47);
          auVar39 = vfmadd213ps_fma(local_178,auVar116,auVar46);
          auVar38 = vsubps_avx(auVar59,auVar57);
          auVar57 = vfmadd213ps_fma(auVar38,auVar116,auVar57);
          auVar38 = vsubps_avx(auVar39,auVar59);
          auVar38 = vfmadd213ps_fma(auVar38,auVar116,auVar59);
          auVar38 = vsubps_avx(auVar38,auVar57);
          auVar39 = vfmadd231ps_fma(auVar57,auVar38,auVar116);
          auVar60 = vmulps_avx512vl(auVar38,auVar53);
          auVar237._8_8_ = auVar39._0_8_;
          auVar237._0_8_ = auVar39._0_8_;
          auVar38 = vshufpd_avx(auVar39,auVar39,3);
          auVar39 = vshufps_avx(auVar43,auVar43,0x55);
          auVar57 = vsubps_avx(auVar38,auVar237);
          auVar59 = vfmadd231ps_fma(auVar237,auVar39,auVar57);
          auVar251._8_8_ = auVar60._0_8_;
          auVar251._0_8_ = auVar60._0_8_;
          auVar38 = vshufpd_avx(auVar60,auVar60,3);
          auVar38 = vsubps_avx(auVar38,auVar251);
          auVar39 = vfmadd213ps_fma(auVar38,auVar39,auVar251);
          auVar117._0_8_ = auVar57._0_8_ ^ 0x8000000080000000;
          auVar117._8_4_ = auVar57._8_4_ ^ 0x80000000;
          auVar117._12_4_ = auVar57._12_4_ ^ 0x80000000;
          auVar38 = vmovshdup_avx(auVar39);
          auVar252._0_8_ = auVar38._0_8_ ^ 0x8000000080000000;
          auVar252._8_4_ = auVar38._8_4_ ^ 0x80000000;
          auVar252._12_4_ = auVar38._12_4_ ^ 0x80000000;
          auVar60 = vmovshdup_avx512vl(auVar57);
          auVar40 = vpermt2ps_avx512vl(auVar252,ZEXT416(5),auVar57);
          auVar38 = vfmsub231ss_avx512f(ZEXT416((uint)(auVar38._0_4_ * auVar57._0_4_)),auVar39,
                                        auVar60);
          auVar39 = vpermt2ps_avx512vl(auVar39,SUB6416(ZEXT464(4),0),auVar117);
          auVar133._0_4_ = auVar38._0_4_;
          auVar133._4_4_ = auVar133._0_4_;
          auVar133._8_4_ = auVar133._0_4_;
          auVar133._12_4_ = auVar133._0_4_;
          auVar38 = vdivps_avx(auVar40,auVar133);
          auVar39 = vdivps_avx(auVar39,auVar133);
          fVar209 = auVar59._0_4_;
          auVar57 = vshufps_avx(auVar59,auVar59,0x55);
          fVar224 = auVar39._0_4_;
          auVar238._0_4_ = fVar209 * auVar38._0_4_ + auVar57._0_4_ * fVar224;
          auVar238._4_4_ = fVar209 * auVar38._4_4_ + auVar57._4_4_ * auVar39._4_4_;
          auVar238._8_4_ = fVar209 * auVar38._8_4_ + auVar57._8_4_ * auVar39._8_4_;
          auVar238._12_4_ = fVar209 * auVar38._12_4_ + auVar57._12_4_ * auVar39._12_4_;
          auVar44 = vsubps_avx(auVar55,auVar238);
          auVar59 = vmovshdup_avx(auVar38);
          auVar55 = vinsertps_avx(auVar192,auVar214,0x1c);
          auVar253._0_4_ = auVar59._0_4_ * auVar55._0_4_;
          auVar253._4_4_ = auVar59._4_4_ * auVar55._4_4_;
          auVar253._8_4_ = auVar59._8_4_ * auVar55._8_4_;
          auVar253._12_4_ = auVar59._12_4_ * auVar55._12_4_;
          auVar57 = vinsertps_avx(auVar182,auVar226,0x1c);
          auVar239._0_4_ = auVar59._0_4_ * auVar57._0_4_;
          auVar239._4_4_ = auVar59._4_4_ * auVar57._4_4_;
          auVar239._8_4_ = auVar59._8_4_ * auVar57._8_4_;
          auVar239._12_4_ = auVar59._12_4_ * auVar57._12_4_;
          auVar42 = vminps_avx512vl(auVar253,auVar239);
          auVar40 = vmaxps_avx(auVar239,auVar253);
          auVar41 = vmovshdup_avx(auVar39);
          auVar59 = vinsertps_avx(auVar214,auVar192,0x4c);
          auVar215._0_4_ = auVar41._0_4_ * auVar59._0_4_;
          auVar215._4_4_ = auVar41._4_4_ * auVar59._4_4_;
          auVar215._8_4_ = auVar41._8_4_ * auVar59._8_4_;
          auVar215._12_4_ = auVar41._12_4_ * auVar59._12_4_;
          auVar60 = vinsertps_avx(auVar226,auVar182,0x4c);
          auVar227._0_4_ = auVar41._0_4_ * auVar60._0_4_;
          auVar227._4_4_ = auVar41._4_4_ * auVar60._4_4_;
          auVar227._8_4_ = auVar41._8_4_ * auVar60._8_4_;
          auVar227._12_4_ = auVar41._12_4_ * auVar60._12_4_;
          auVar41 = vminps_avx(auVar215,auVar227);
          auVar42 = vaddps_avx512vl(auVar42,auVar41);
          auVar41 = vmaxps_avx(auVar227,auVar215);
          auVar216._0_4_ = auVar40._0_4_ + auVar41._0_4_;
          auVar216._4_4_ = auVar40._4_4_ + auVar41._4_4_;
          auVar216._8_4_ = auVar40._8_4_ + auVar41._8_4_;
          auVar216._12_4_ = auVar40._12_4_ + auVar41._12_4_;
          auVar228._8_8_ = 0x3f80000000000000;
          auVar228._0_8_ = 0x3f80000000000000;
          auVar40 = vsubps_avx(auVar228,auVar216);
          auVar41 = vsubps_avx(auVar228,auVar42);
          auVar42 = vsubps_avx(auVar45,auVar43);
          auVar43 = vsubps_avx(auVar58,auVar43);
          fVar222 = auVar42._0_4_;
          auVar254._0_4_ = fVar222 * auVar40._0_4_;
          fVar223 = auVar42._4_4_;
          auVar254._4_4_ = fVar223 * auVar40._4_4_;
          fVar138 = auVar42._8_4_;
          auVar254._8_4_ = fVar138 * auVar40._8_4_;
          fVar139 = auVar42._12_4_;
          auVar254._12_4_ = fVar139 * auVar40._12_4_;
          auVar61 = vbroadcastss_avx512vl(auVar38);
          auVar55 = vmulps_avx512vl(auVar61,auVar55);
          auVar57 = vmulps_avx512vl(auVar61,auVar57);
          auVar61 = vminps_avx512vl(auVar55,auVar57);
          auVar55 = vmaxps_avx(auVar57,auVar55);
          auVar193._0_4_ = fVar224 * auVar59._0_4_;
          auVar193._4_4_ = fVar224 * auVar59._4_4_;
          auVar193._8_4_ = fVar224 * auVar59._8_4_;
          auVar193._12_4_ = fVar224 * auVar59._12_4_;
          auVar183._0_4_ = fVar224 * auVar60._0_4_;
          auVar183._4_4_ = fVar224 * auVar60._4_4_;
          auVar183._8_4_ = fVar224 * auVar60._8_4_;
          auVar183._12_4_ = fVar224 * auVar60._12_4_;
          auVar57 = vminps_avx(auVar193,auVar183);
          auVar59 = vaddps_avx512vl(auVar61,auVar57);
          auVar60 = vmulps_avx512vl(auVar42,auVar41);
          fVar209 = auVar43._0_4_;
          auVar217._0_4_ = fVar209 * auVar40._0_4_;
          fVar219 = auVar43._4_4_;
          auVar217._4_4_ = fVar219 * auVar40._4_4_;
          fVar220 = auVar43._8_4_;
          auVar217._8_4_ = fVar220 * auVar40._8_4_;
          fVar221 = auVar43._12_4_;
          auVar217._12_4_ = fVar221 * auVar40._12_4_;
          auVar229._0_4_ = fVar209 * auVar41._0_4_;
          auVar229._4_4_ = fVar219 * auVar41._4_4_;
          auVar229._8_4_ = fVar220 * auVar41._8_4_;
          auVar229._12_4_ = fVar221 * auVar41._12_4_;
          auVar57 = vmaxps_avx(auVar183,auVar193);
          auVar184._0_4_ = auVar55._0_4_ + auVar57._0_4_;
          auVar184._4_4_ = auVar55._4_4_ + auVar57._4_4_;
          auVar184._8_4_ = auVar55._8_4_ + auVar57._8_4_;
          auVar184._12_4_ = auVar55._12_4_ + auVar57._12_4_;
          auVar194._8_8_ = 0x3f800000;
          auVar194._0_8_ = 0x3f800000;
          auVar55 = vsubps_avx(auVar194,auVar184);
          auVar57 = vsubps_avx(auVar194,auVar59);
          auVar245._0_4_ = fVar222 * auVar55._0_4_;
          auVar245._4_4_ = fVar223 * auVar55._4_4_;
          auVar245._8_4_ = fVar138 * auVar55._8_4_;
          auVar245._12_4_ = fVar139 * auVar55._12_4_;
          auVar240._0_4_ = fVar222 * auVar57._0_4_;
          auVar240._4_4_ = fVar223 * auVar57._4_4_;
          auVar240._8_4_ = fVar138 * auVar57._8_4_;
          auVar240._12_4_ = fVar139 * auVar57._12_4_;
          auVar185._0_4_ = fVar209 * auVar55._0_4_;
          auVar185._4_4_ = fVar219 * auVar55._4_4_;
          auVar185._8_4_ = fVar220 * auVar55._8_4_;
          auVar185._12_4_ = fVar221 * auVar55._12_4_;
          auVar195._0_4_ = fVar209 * auVar57._0_4_;
          auVar195._4_4_ = fVar219 * auVar57._4_4_;
          auVar195._8_4_ = fVar220 * auVar57._8_4_;
          auVar195._12_4_ = fVar221 * auVar57._12_4_;
          auVar55 = vminps_avx(auVar245,auVar240);
          auVar57 = vminps_avx(auVar185,auVar195);
          auVar59 = vminps_avx(auVar55,auVar57);
          auVar55 = vmaxps_avx(auVar240,auVar245);
          auVar57 = vmaxps_avx(auVar195,auVar185);
          auVar57 = vmaxps_avx(auVar57,auVar55);
          auVar40 = vminps_avx512vl(auVar254,auVar60);
          auVar55 = vminps_avx(auVar217,auVar229);
          auVar55 = vminps_avx(auVar40,auVar55);
          auVar55 = vhaddps_avx(auVar59,auVar55);
          auVar60 = vmaxps_avx512vl(auVar60,auVar254);
          auVar59 = vmaxps_avx(auVar229,auVar217);
          auVar59 = vmaxps_avx(auVar59,auVar60);
          auVar57 = vhaddps_avx(auVar57,auVar59);
          auVar55 = vshufps_avx(auVar55,auVar55,0xe8);
          auVar57 = vshufps_avx(auVar57,auVar57,0xe8);
          auVar186._0_4_ = auVar55._0_4_ + auVar44._0_4_;
          auVar186._4_4_ = auVar55._4_4_ + auVar44._4_4_;
          auVar186._8_4_ = auVar55._8_4_ + auVar44._8_4_;
          auVar186._12_4_ = auVar55._12_4_ + auVar44._12_4_;
          auVar196._0_4_ = auVar57._0_4_ + auVar44._0_4_;
          auVar196._4_4_ = auVar57._4_4_ + auVar44._4_4_;
          auVar196._8_4_ = auVar57._8_4_ + auVar44._8_4_;
          auVar196._12_4_ = auVar57._12_4_ + auVar44._12_4_;
          auVar55 = vmaxps_avx(auVar45,auVar186);
          auVar57 = vminps_avx(auVar196,auVar58);
          uVar37 = vcmpps_avx512vl(auVar57,auVar55,1);
          auVar55 = vinsertps_avx(auVar48,auVar49,0x10);
          auVar259 = ZEXT1664(auVar55);
          if ((uVar37 & 3) == 0) {
            vucomiss_avx512f(auVar54);
            if (uVar33 < 4 && (uVar6 == 0 || lVar31 == 0)) {
              bVar18 = false;
            }
            else {
              lVar31 = 200;
              do {
                auVar57 = vsubss_avx512f(auVar56,auVar44);
                fVar220 = auVar57._0_4_;
                fVar209 = fVar220 * fVar220 * fVar220;
                fVar221 = auVar44._0_4_;
                fVar219 = fVar221 * 3.0 * fVar220 * fVar220;
                fVar220 = fVar220 * fVar221 * fVar221 * 3.0;
                auVar164._4_4_ = fVar209;
                auVar164._0_4_ = fVar209;
                auVar164._8_4_ = fVar209;
                auVar164._12_4_ = fVar209;
                auVar146._4_4_ = fVar219;
                auVar146._0_4_ = fVar219;
                auVar146._8_4_ = fVar219;
                auVar146._12_4_ = fVar219;
                auVar108._4_4_ = fVar220;
                auVar108._0_4_ = fVar220;
                auVar108._8_4_ = fVar220;
                auVar108._12_4_ = fVar220;
                fVar221 = fVar221 * fVar221 * fVar221;
                auVar174._0_4_ = (float)local_3c8._0_4_ * fVar221;
                auVar174._4_4_ = (float)local_3c8._4_4_ * fVar221;
                auVar174._8_4_ = fStack_3c0 * fVar221;
                auVar174._12_4_ = fStack_3bc * fVar221;
                auVar57 = vfmadd231ps_fma(auVar174,auVar46,auVar108);
                auVar57 = vfmadd231ps_avx512vl(auVar57,auVar47,auVar146);
                auVar57 = vfmadd231ps_avx512vl(auVar57,auVar50,auVar164);
                auVar109._8_8_ = auVar57._0_8_;
                auVar109._0_8_ = auVar57._0_8_;
                auVar57 = vshufpd_avx(auVar57,auVar57,3);
                auVar58 = vshufps_avx(auVar44,auVar44,0x55);
                auVar57 = vsubps_avx(auVar57,auVar109);
                auVar58 = vfmadd213ps_fma(auVar57,auVar58,auVar109);
                fVar209 = auVar58._0_4_;
                auVar57 = vshufps_avx(auVar58,auVar58,0x55);
                auVar110._0_4_ = auVar38._0_4_ * fVar209 + fVar224 * auVar57._0_4_;
                auVar110._4_4_ = auVar38._4_4_ * fVar209 + auVar39._4_4_ * auVar57._4_4_;
                auVar110._8_4_ = auVar38._8_4_ * fVar209 + auVar39._8_4_ * auVar57._8_4_;
                auVar110._12_4_ = auVar38._12_4_ * fVar209 + auVar39._12_4_ * auVar57._12_4_;
                auVar44 = vsubps_avx(auVar44,auVar110);
                auVar57 = vandps_avx512vl(auVar58,auVar261._0_16_);
                auVar58 = vprolq_avx512vl(auVar57,0x20);
                auVar57 = vmaxss_avx(auVar58,auVar57);
                bVar35 = auVar57._0_4_ <= (float)local_3d8._0_4_;
                if (auVar57._0_4_ < (float)local_3d8._0_4_) {
                  auVar38 = vucomiss_avx512f(auVar51);
                  if (bVar35) {
                    auVar39 = vucomiss_avx512f(auVar38);
                    auVar262 = ZEXT1664(auVar39);
                    if (bVar35) {
                      vmovshdup_avx(auVar38);
                      auVar39 = vucomiss_avx512f(auVar51);
                      if (bVar35) {
                        auVar56 = vucomiss_avx512f(auVar39);
                        auVar262 = ZEXT1664(auVar56);
                        if (bVar35) {
                          auVar57 = vinsertps_avx(ZEXT416((uint)pre->ray_space[k].vx.field_0.m128[2]
                                                         ),ZEXT416((uint)pre->ray_space[k].vy.
                                                                         field_0.m128[2]),0x1c);
                          auVar43 = vinsertps_avx(auVar57,ZEXT416((uint)pre->ray_space[k].vz.field_0
                                                                        .m128[2]),0x28);
                          auVar57 = vdpps_avx(auVar43,local_188,0x7f);
                          auVar58 = vdpps_avx(auVar43,local_198,0x7f);
                          auVar59 = vdpps_avx(auVar43,local_1a8,0x7f);
                          auVar60 = vdpps_avx(auVar43,local_1b8,0x7f);
                          auVar40 = vdpps_avx(auVar43,local_1c8,0x7f);
                          auVar41 = vdpps_avx(auVar43,local_1d8,0x7f);
                          auVar42 = vdpps_avx(auVar43,local_1e8,0x7f);
                          auVar43 = vdpps_avx(auVar43,local_1f8,0x7f);
                          auVar44 = vsubss_avx512f(auVar56,auVar39);
                          fVar224 = auVar39._0_4_;
                          auVar39 = vfmadd231ss_fma(ZEXT416((uint)(fVar224 * auVar40._0_4_)),auVar44
                                                    ,auVar57);
                          auVar57 = vfmadd231ss_fma(ZEXT416((uint)(auVar41._0_4_ * fVar224)),auVar44
                                                    ,auVar58);
                          auVar58 = vfmadd231ss_fma(ZEXT416((uint)(auVar42._0_4_ * fVar224)),auVar44
                                                    ,auVar59);
                          auVar59 = vfmadd231ss_fma(ZEXT416((uint)(fVar224 * auVar43._0_4_)),auVar44
                                                    ,auVar60);
                          auVar56 = vsubss_avx512f(auVar56,auVar38);
                          auVar187._0_4_ = auVar56._0_4_;
                          fVar224 = auVar187._0_4_ * auVar187._0_4_ * auVar187._0_4_;
                          local_f8 = auVar38._0_4_;
                          fVar209 = local_f8 * 3.0 * auVar187._0_4_ * auVar187._0_4_;
                          fVar219 = auVar187._0_4_ * local_f8 * local_f8 * 3.0;
                          fVar221 = local_f8 * local_f8 * local_f8;
                          auVar56 = vfmadd231ss_fma(ZEXT416((uint)(fVar221 * auVar59._0_4_)),
                                                    ZEXT416((uint)fVar219),auVar58);
                          auVar56 = vfmadd231ss_fma(auVar56,ZEXT416((uint)fVar209),auVar57);
                          auVar39 = vfmadd231ss_fma(auVar56,ZEXT416((uint)fVar224),auVar39);
                          fVar220 = auVar39._0_4_;
                          if ((fVar95 <= fVar220) &&
                             (fVar222 = *(float *)(ray + k * 4 + 0x80), fVar220 <= fVar222)) {
                            local_e8 = vshufps_avx(auVar38,auVar38,0x55);
                            auVar197._8_4_ = 0x3f800000;
                            auVar197._0_8_ = &DAT_3f8000003f800000;
                            auVar197._12_4_ = 0x3f800000;
                            auVar38 = vsubps_avx(auVar197,local_e8);
                            fVar223 = local_e8._0_4_;
                            auVar206._0_4_ = fVar223 * (float)local_248._0_4_;
                            fVar138 = local_e8._4_4_;
                            auVar206._4_4_ = fVar138 * (float)local_248._4_4_;
                            fVar139 = local_e8._8_4_;
                            auVar206._8_4_ = fVar139 * fStack_240;
                            fVar140 = local_e8._12_4_;
                            auVar206._12_4_ = fVar140 * fStack_23c;
                            auVar218._0_4_ = fVar223 * (float)local_258._0_4_;
                            auVar218._4_4_ = fVar138 * (float)local_258._4_4_;
                            auVar218._8_4_ = fVar139 * fStack_250;
                            auVar218._12_4_ = fVar140 * fStack_24c;
                            auVar230._0_4_ = fVar223 * (float)local_268._0_4_;
                            auVar230._4_4_ = fVar138 * (float)local_268._4_4_;
                            auVar230._8_4_ = fVar139 * fStack_260;
                            auVar230._12_4_ = fVar140 * fStack_25c;
                            auVar241._0_4_ = fVar223 * (float)local_278._0_4_;
                            auVar241._4_4_ = fVar138 * (float)local_278._4_4_;
                            auVar241._8_4_ = fVar139 * fStack_270;
                            auVar241._12_4_ = fVar140 * fStack_26c;
                            auVar39 = vfmadd231ps_fma(auVar206,auVar38,local_208);
                            auVar56 = vfmadd231ps_fma(auVar218,auVar38,local_218);
                            auVar57 = vfmadd231ps_fma(auVar230,auVar38,local_228);
                            auVar58 = vfmadd231ps_fma(auVar241,auVar38,local_238);
                            auVar38 = vsubps_avx(auVar56,auVar39);
                            auVar39 = vsubps_avx(auVar57,auVar56);
                            auVar56 = vsubps_avx(auVar58,auVar57);
                            auVar231._0_4_ = auVar39._0_4_ * local_f8;
                            auVar231._4_4_ = auVar39._4_4_ * local_f8;
                            auVar231._8_4_ = auVar39._8_4_ * local_f8;
                            auVar231._12_4_ = auVar39._12_4_ * local_f8;
                            auVar187._4_4_ = auVar187._0_4_;
                            auVar187._8_4_ = auVar187._0_4_;
                            auVar187._12_4_ = auVar187._0_4_;
                            auVar38 = vfmadd231ps_fma(auVar231,auVar187,auVar38);
                            auVar198._0_4_ = auVar56._0_4_ * local_f8;
                            auVar198._4_4_ = auVar56._4_4_ * local_f8;
                            auVar198._8_4_ = auVar56._8_4_ * local_f8;
                            auVar198._12_4_ = auVar56._12_4_ * local_f8;
                            auVar39 = vfmadd231ps_fma(auVar198,auVar187,auVar39);
                            auVar199._0_4_ = auVar39._0_4_ * local_f8;
                            auVar199._4_4_ = auVar39._4_4_ * local_f8;
                            auVar199._8_4_ = auVar39._8_4_ * local_f8;
                            auVar199._12_4_ = auVar39._12_4_ * local_f8;
                            auVar38 = vfmadd231ps_fma(auVar199,auVar187,auVar38);
                            auVar38 = vmulps_avx512vl(auVar38,auVar53);
                            pGVar7 = (context->scene->geometries).items[uVar27].ptr;
                            if ((pGVar7->mask & *(uint *)(ray + k * 4 + 0x90)) == 0) {
                              bVar35 = false;
                            }
                            else if ((context->args->filter != (RTCFilterFunctionN)0x0) ||
                                    (bVar35 = true,
                                    pGVar7->occlusionFilterN != (RTCFilterFunctionN)0x0)) {
                              auVar175._0_4_ = fVar221 * (float)local_2d8._0_4_;
                              auVar175._4_4_ = fVar221 * (float)local_2d8._4_4_;
                              auVar175._8_4_ = fVar221 * fStack_2d0;
                              auVar175._12_4_ = fVar221 * fStack_2cc;
                              auVar165._4_4_ = fVar219;
                              auVar165._0_4_ = fVar219;
                              auVar165._8_4_ = fVar219;
                              auVar165._12_4_ = fVar219;
                              auVar39 = vfmadd132ps_fma(auVar165,auVar175,local_2c8);
                              auVar134._4_4_ = fVar209;
                              auVar134._0_4_ = fVar209;
                              auVar134._8_4_ = fVar209;
                              auVar134._12_4_ = fVar209;
                              auVar39 = vfmadd132ps_fma(auVar134,auVar39,local_2b8);
                              auVar118._4_4_ = fVar224;
                              auVar118._0_4_ = fVar224;
                              auVar118._8_4_ = fVar224;
                              auVar118._12_4_ = fVar224;
                              auVar56 = vfmadd132ps_fma(auVar118,auVar39,local_2a8);
                              auVar39 = vshufps_avx(auVar56,auVar56,0xc9);
                              auVar53 = vshufps_avx(auVar38,auVar38,0xc9);
                              auVar119._0_4_ = auVar56._0_4_ * auVar53._0_4_;
                              auVar119._4_4_ = auVar56._4_4_ * auVar53._4_4_;
                              auVar119._8_4_ = auVar56._8_4_ * auVar53._8_4_;
                              auVar119._12_4_ = auVar56._12_4_ * auVar53._12_4_;
                              auVar39 = vfmsub231ps_fma(auVar119,auVar38,auVar39);
                              auVar38 = vshufps_avx(auVar39,auVar39,0x55);
                              local_118 = vshufps_avx(auVar39,auVar39,0xaa);
                              local_108 = auVar39._0_4_;
                              local_128[0] = (RTCHitN)auVar38[0];
                              local_128[1] = (RTCHitN)auVar38[1];
                              local_128[2] = (RTCHitN)auVar38[2];
                              local_128[3] = (RTCHitN)auVar38[3];
                              local_128[4] = (RTCHitN)auVar38[4];
                              local_128[5] = (RTCHitN)auVar38[5];
                              local_128[6] = (RTCHitN)auVar38[6];
                              local_128[7] = (RTCHitN)auVar38[7];
                              local_128[8] = (RTCHitN)auVar38[8];
                              local_128[9] = (RTCHitN)auVar38[9];
                              local_128[10] = (RTCHitN)auVar38[10];
                              local_128[0xb] = (RTCHitN)auVar38[0xb];
                              local_128[0xc] = (RTCHitN)auVar38[0xc];
                              local_128[0xd] = (RTCHitN)auVar38[0xd];
                              local_128[0xe] = (RTCHitN)auVar38[0xe];
                              local_128[0xf] = (RTCHitN)auVar38[0xf];
                              uStack_104 = local_108;
                              uStack_100 = local_108;
                              uStack_fc = local_108;
                              fStack_f4 = local_f8;
                              fStack_f0 = local_f8;
                              fStack_ec = local_f8;
                              local_d8 = local_298._0_8_;
                              uStack_d0 = local_298._8_8_;
                              local_c8 = local_2e8;
                              vpcmpeqd_avx2(ZEXT1632(local_2e8),ZEXT1632(local_2e8));
                              uStack_b4 = context->user->instID[0];
                              local_b8 = uStack_b4;
                              uStack_b0 = uStack_b4;
                              uStack_ac = uStack_b4;
                              uStack_a8 = context->user->instPrimID[0];
                              uStack_a4 = uStack_a8;
                              uStack_a0 = uStack_a8;
                              uStack_9c = uStack_a8;
                              *(float *)(ray + k * 4 + 0x80) = fVar220;
                              local_3f8 = local_2f8._0_8_;
                              uStack_3f0 = local_2f8._8_8_;
                              local_328.valid = (int *)&local_3f8;
                              local_328.geometryUserPtr = pGVar7->userPtr;
                              local_328.context = context->user;
                              local_328.ray = (RTCRayN *)ray;
                              local_328.hit = local_128;
                              local_328.N = 4;
                              if (pGVar7->occlusionFilterN != (RTCFilterFunctionN)0x0) {
                                local_3e8 = uVar27;
                                (*pGVar7->occlusionFilterN)(&local_328);
                                in_ZMM22 = ZEXT464(0x38d1b717);
                                auVar80 = vbroadcastss_avx512vl(ZEXT416(0x40400000));
                                in_ZMM17 = ZEXT3264(auVar80);
                                auVar262 = ZEXT464(0x3f800000);
                                auVar38 = vbroadcastss_avx512vl(ZEXT416(0x40400000));
                                auVar260 = ZEXT1664(auVar38);
                                auVar38 = vxorps_avx512vl(auVar51,auVar51);
                                auVar265 = ZEXT1664(auVar38);
                                auVar38 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
                                auVar261 = ZEXT1664(auVar38);
                                uVar27 = local_3e8;
                              }
                              auVar38 = auVar265._0_16_;
                              auVar23._8_8_ = uStack_3f0;
                              auVar23._0_8_ = local_3f8;
                              uVar37 = vptestmd_avx512vl(auVar23,auVar23);
                              if ((uVar37 & 0xf) == 0) {
                                bVar35 = false;
                              }
                              else {
                                p_Var12 = context->args->filter;
                                if ((p_Var12 != (RTCFilterFunctionN)0x0) &&
                                   (((context->args->flags &
                                     RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                                     RTC_RAY_QUERY_FLAG_INCOHERENT ||
                                    (((pGVar7->field_8).field_0x2 & 0x40) != 0)))) {
                                  (*p_Var12)(&local_328);
                                  in_ZMM22 = ZEXT464(0x38d1b717);
                                  auVar80 = vbroadcastss_avx512vl(ZEXT416(0x40400000));
                                  in_ZMM17 = ZEXT3264(auVar80);
                                  auVar262 = ZEXT464(0x3f800000);
                                  auVar39 = vbroadcastss_avx512vl(ZEXT416(0x40400000));
                                  auVar260 = ZEXT1664(auVar39);
                                  auVar38 = vxorps_avx512vl(auVar38,auVar38);
                                  auVar265 = ZEXT1664(auVar38);
                                  auVar38 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
                                  auVar261 = ZEXT1664(auVar38);
                                }
                                auVar24._8_8_ = uStack_3f0;
                                auVar24._0_8_ = local_3f8;
                                uVar37 = vptestmd_avx512vl(auVar24,auVar24);
                                uVar37 = uVar37 & 0xf;
                                auVar38 = vbroadcastss_avx512vl(ZEXT416(0xff800000));
                                bVar35 = (bool)((byte)uVar37 & 1);
                                bVar13 = (bool)((byte)(uVar37 >> 1) & 1);
                                bVar14 = (bool)((byte)(uVar37 >> 2) & 1);
                                bVar15 = SUB81(uVar37 >> 3,0);
                                *(uint *)(local_328.ray + 0x80) =
                                     (uint)bVar35 * auVar38._0_4_ |
                                     (uint)!bVar35 * *(int *)(local_328.ray + 0x80);
                                *(uint *)(local_328.ray + 0x84) =
                                     (uint)bVar13 * auVar38._4_4_ |
                                     (uint)!bVar13 * *(int *)(local_328.ray + 0x84);
                                *(uint *)(local_328.ray + 0x88) =
                                     (uint)bVar14 * auVar38._8_4_ |
                                     (uint)!bVar14 * *(int *)(local_328.ray + 0x88);
                                *(uint *)(local_328.ray + 0x8c) =
                                     (uint)bVar15 * auVar38._12_4_ |
                                     (uint)!bVar15 * *(int *)(local_328.ray + 0x8c);
                                bVar35 = (byte)uVar37 != 0;
                              }
                              if (!bVar35) {
                                *(float *)(ray + k * 4 + 0x80) = fVar222;
                              }
                            }
                            auVar259 = ZEXT1664(auVar55);
                            bVar34 = (bool)(bVar34 | bVar35);
                          }
                        }
                      }
                    }
                  }
                  break;
                }
                lVar31 = lVar31 + -1;
              } while (lVar31 != 0);
            }
          }
        }
      }
    } while (bVar18);
    auVar38 = vinsertps_avx512f(auVar54,auVar52,0x10);
  } while( true );
}

Assistant:

static __forceinline bool occluded_n(Precalculations& pre, RayK<K>& ray, const size_t k, RayQueryContext* context, const Primitive& prim)
      {
        vfloat<M> tNear;
        vbool<M> valid = intersect(ray,k,prim,tNear);

        const size_t N = prim.N;
        size_t mask = movemask(valid);
        while (mask)
        {
          const size_t i = bscf(mask);
          STAT3(shadow.trav_prims,1,1,1);
          const unsigned int geomID = prim.geomID(N);
          const unsigned int primID = prim.primID(N)[i];
          const CurveGeometry* geom = context->scene->get<CurveGeometry>(geomID);
          const Vec3fa ray_org(ray.org.x[k], ray.org.y[k], ray.org.z[k]);
          const TensorLinearCubicBezierSurface3fa curve = geom->getNormalOrientedCurve<typename Intersector::SourceCurve3ff, typename Intersector::SourceCurve3fa, TensorLinearCubicBezierSurface3fa>(context, ray_org, primID,ray.time()[k]);
          
          if (Intersector().intersect(pre,ray,k,context,geom,primID,curve,Epilog(ray,k,context,geomID,primID)))
            return true;

          mask &= movemask(tNear <= vfloat<M>(ray.tfar[k]));
        }
        return false;
      }